

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  uint uVar18;
  BVH *bvh;
  NodeRef root;
  ulong uVar19;
  RTCRayQueryContext *pRVar20;
  RTCFilterFunctionN p_Var21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  size_t k;
  Geometry *pGVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [28];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  int iVar93;
  ulong uVar94;
  long lVar95;
  undefined1 (*pauVar96) [32];
  undefined1 auVar97 [8];
  uint uVar98;
  ulong *puVar99;
  ulong uVar100;
  undefined4 uVar101;
  Geometry *unaff_R15;
  bool bVar102;
  float fVar103;
  float fVar120;
  float fVar122;
  float fVar124;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar135;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar147;
  float fVar149;
  float fVar151;
  float fVar153;
  float fVar155;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar145;
  float fVar146;
  float fVar148;
  float fVar150;
  float fVar152;
  float fVar154;
  undefined1 in_ZMM2 [64];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar166 [64];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar191;
  undefined1 auVar190 [64];
  undefined1 auVar192 [32];
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar193 [64];
  float fVar200;
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vbool<8> terminated;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2da9;
  Geometry *local_2da8;
  undefined1 local_2da0 [8];
  undefined1 auStack_2d98 [8];
  float fStack_2d90;
  float fStack_2d8c;
  float fStack_2d88;
  RayK<8> *local_2d68;
  undefined1 local_2d60 [32];
  undefined1 local_2d40 [32];
  undefined1 (*local_2d18) [32];
  RTCFilterFunctionNArguments local_2d10;
  undefined1 local_2ce0 [32];
  undefined1 local_2cc0 [32];
  undefined1 local_2ca0 [32];
  ulong local_2c70;
  long local_2c68;
  undefined1 local_2c60 [32];
  undefined1 local_2c40 [8];
  float fStack_2c38;
  float fStack_2c34;
  float fStack_2c30;
  float fStack_2c2c;
  float fStack_2c28;
  undefined4 uStack_2c24;
  undefined1 local_2c20 [32];
  undefined8 local_2bf0;
  undefined8 uStack_2be8;
  undefined1 local_2be0 [32];
  undefined1 local_2bc0 [32];
  undefined1 local_2ba0 [32];
  undefined1 local_2b80 [32];
  undefined1 local_2b60 [32];
  undefined1 local_2b40 [32];
  undefined1 local_2b20 [32];
  undefined1 local_2b00 [32];
  undefined1 local_2ae0 [32];
  undefined1 local_2ac0 [32];
  undefined1 local_2aa0 [32];
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  RTCHitN local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined4 local_29a0;
  undefined4 uStack_299c;
  undefined4 uStack_2998;
  undefined4 uStack_2994;
  undefined4 uStack_2990;
  undefined4 uStack_298c;
  undefined4 uStack_2988;
  undefined4 uStack_2984;
  uint local_2980;
  uint uStack_297c;
  uint uStack_2978;
  uint uStack_2974;
  uint uStack_2970;
  uint uStack_296c;
  uint uStack_2968;
  uint uStack_2964;
  uint local_2960;
  uint uStack_295c;
  uint uStack_2958;
  uint uStack_2954;
  uint uStack_2950;
  uint uStack_294c;
  uint uStack_2948;
  uint uStack_2944;
  uint local_2940;
  uint uStack_293c;
  uint uStack_2938;
  uint uStack_2934;
  uint uStack_2930;
  uint uStack_292c;
  uint uStack_2928;
  uint uStack_2924;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2920;
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [8];
  float fStack_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  float fStack_2848;
  undefined1 local_2840 [8];
  float fStack_2838;
  float fStack_2834;
  float fStack_2830;
  float fStack_282c;
  float fStack_2828;
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar115 [32];
  float fVar119;
  float fVar121;
  float fVar123;
  undefined1 auVar165 [64];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar144 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar125 = ZEXT816(0) << 0x40;
      auVar160 = vpcmpeqd_avx2(auVar144,(undefined1  [32])valid_i->field_0);
      auVar144 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar125),5);
      auVar138 = auVar160 & auVar144;
      if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar138 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar138 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar138 >> 0x7f,0) != '\0') ||
            (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar138 >> 0xbf,0) != '\0') ||
          (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar138[0x1f] < '\0') {
        auVar144 = vandps_avx(auVar144,auVar160);
        auVar31 = vpackssdw_avx(auVar144._0_16_,auVar144._16_16_);
        local_2920._0_8_ = *(undefined8 *)ray;
        local_2920._8_8_ = *(undefined8 *)(ray + 8);
        local_2920._16_8_ = *(undefined8 *)(ray + 0x10);
        local_2920._24_8_ = *(undefined8 *)(ray + 0x18);
        local_2920._32_8_ = *(undefined8 *)(ray + 0x20);
        local_2920._40_8_ = *(undefined8 *)(ray + 0x28);
        local_2920._48_8_ = *(undefined8 *)(ray + 0x30);
        local_2920._56_8_ = *(undefined8 *)(ray + 0x38);
        local_2920._64_8_ = *(undefined8 *)(ray + 0x40);
        local_2920._72_8_ = *(undefined8 *)(ray + 0x48);
        local_2920._80_8_ = *(undefined8 *)(ray + 0x50);
        local_2920._88_8_ = *(undefined8 *)(ray + 0x58);
        local_28c0 = *(undefined1 (*) [32])(ray + 0x80);
        local_28a0 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar113._8_4_ = 0x7fffffff;
        auVar113._0_8_ = 0x7fffffff7fffffff;
        auVar113._12_4_ = 0x7fffffff;
        auVar113._16_4_ = 0x7fffffff;
        auVar113._20_4_ = 0x7fffffff;
        auVar113._24_4_ = 0x7fffffff;
        auVar113._28_4_ = 0x7fffffff;
        auVar183 = ZEXT3264(auVar113);
        auVar184._8_4_ = 0x219392ef;
        auVar184._0_8_ = 0x219392ef219392ef;
        auVar184._12_4_ = 0x219392ef;
        auVar184._16_4_ = 0x219392ef;
        auVar184._20_4_ = 0x219392ef;
        auVar184._24_4_ = 0x219392ef;
        auVar184._28_4_ = 0x219392ef;
        auVar186._8_4_ = 0x3f800000;
        auVar186._0_8_ = &DAT_3f8000003f800000;
        auVar186._12_4_ = 0x3f800000;
        auVar186._16_4_ = 0x3f800000;
        auVar186._20_4_ = 0x3f800000;
        auVar186._24_4_ = 0x3f800000;
        auVar186._28_4_ = 0x3f800000;
        local_2880 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar161 = vdivps_avx(auVar186,local_28c0);
        auVar144 = vandps_avx(auVar113,local_28c0);
        auVar138 = vcmpps_avx(auVar144,auVar184,1);
        auVar144 = vandps_avx(auVar113,local_28a0);
        auVar160 = vcmpps_avx(auVar144,auVar184,1);
        auVar174 = ZEXT3264(auVar160);
        auVar139 = vdivps_avx(auVar186,local_28a0);
        auVar144 = vandps_avx(auVar113,local_2880);
        auVar129._8_4_ = 0x5d5e0b6b;
        auVar129._0_8_ = 0x5d5e0b6b5d5e0b6b;
        auVar129._12_4_ = 0x5d5e0b6b;
        auVar129._16_4_ = 0x5d5e0b6b;
        auVar129._20_4_ = 0x5d5e0b6b;
        auVar129._24_4_ = 0x5d5e0b6b;
        auVar129._28_4_ = 0x5d5e0b6b;
        auVar179 = ZEXT3264(auVar129);
        _local_2860 = vblendvps_avx(auVar161,auVar129,auVar138);
        auVar144 = vcmpps_avx(auVar144,auVar184,1);
        auVar138 = vdivps_avx(auVar186,local_2880);
        _local_2840 = vblendvps_avx(auVar139,auVar129,auVar160);
        local_2820 = vblendvps_avx(auVar138,auVar129,auVar144);
        auVar144 = vcmpps_avx(_local_2860,ZEXT1632(auVar125),1);
        auVar139._8_4_ = 0x10;
        auVar139._0_8_ = 0x1000000010;
        auVar139._12_4_ = 0x10;
        auVar139._16_4_ = 0x10;
        auVar139._20_4_ = 0x10;
        auVar139._24_4_ = 0x10;
        auVar139._28_4_ = 0x10;
        local_2800 = vandps_avx(auVar144,auVar139);
        auVar138 = ZEXT1632(auVar125);
        auVar144 = vcmpps_avx(_local_2840,auVar138,5);
        auVar160._8_4_ = 0x20;
        auVar160._0_8_ = 0x2000000020;
        auVar160._12_4_ = 0x20;
        auVar160._16_4_ = 0x20;
        auVar160._20_4_ = 0x20;
        auVar160._24_4_ = 0x20;
        auVar160._28_4_ = 0x20;
        auVar115._8_4_ = 0x30;
        auVar115._0_8_ = 0x3000000030;
        auVar115._12_4_ = 0x30;
        auVar115._16_4_ = 0x30;
        auVar115._20_4_ = 0x30;
        auVar115._24_4_ = 0x30;
        auVar115._28_4_ = 0x30;
        local_27e0 = vblendvps_avx(auVar115,auVar160,auVar144);
        auVar144 = vcmpps_avx(local_2820,auVar138,5);
        auVar161._8_4_ = 0x40;
        auVar161._0_8_ = 0x4000000040;
        auVar161._12_4_ = 0x40;
        auVar161._16_4_ = 0x40;
        auVar161._20_4_ = 0x40;
        auVar161._24_4_ = 0x40;
        auVar161._28_4_ = 0x40;
        auVar164._8_4_ = 0x50;
        auVar164._0_8_ = 0x5000000050;
        auVar164._12_4_ = 0x50;
        auVar164._16_4_ = 0x50;
        auVar164._20_4_ = 0x50;
        auVar164._24_4_ = 0x50;
        auVar164._28_4_ = 0x50;
        auVar165 = ZEXT3264(auVar164);
        local_27c0 = vblendvps_avx(auVar164,auVar161,auVar144);
        auVar144 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar138);
        local_2720 = vpmovsxwd_avx2(auVar31);
        local_1e80._8_4_ = 0x7f800000;
        local_1e80._0_8_ = 0x7f8000007f800000;
        local_1e80._12_4_ = 0x7f800000;
        local_1e80._16_4_ = 0x7f800000;
        local_1e80._20_4_ = 0x7f800000;
        local_1e80._24_4_ = 0x7f800000;
        local_1e80._28_4_ = 0x7f800000;
        auVar185 = ZEXT3264(local_1e80);
        local_27a0 = vblendvps_avx(local_1e80,auVar144,local_2720);
        auVar144 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar138);
        auVar138._8_4_ = 0xff800000;
        auVar138._0_8_ = 0xff800000ff800000;
        auVar138._12_4_ = 0xff800000;
        auVar138._16_4_ = 0xff800000;
        auVar138._20_4_ = 0xff800000;
        auVar138._24_4_ = 0xff800000;
        auVar138._28_4_ = 0xff800000;
        auVar134 = ZEXT3264(auVar138);
        local_2780 = vblendvps_avx(auVar138,auVar144,local_2720);
        auVar125 = vpcmpeqd_avx(local_2780._0_16_,local_2780._0_16_);
        local_2c20 = vpmovsxwd_avx2(auVar31 ^ auVar125);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar98 = 5;
        }
        else {
          uVar98 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2d68 = ray + 0x100;
        puVar99 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar96 = (undefined1 (*) [32])local_1e40;
        local_2608 = (bvh->root).ptr;
        local_1e60 = local_27a0;
        local_2740 = mm_lookupmask_ps._16_8_;
        uStack_2738 = mm_lookupmask_ps._24_8_;
        uStack_2730 = mm_lookupmask_ps._16_8_;
        uStack_2728 = mm_lookupmask_ps._24_8_;
        local_2d18 = (undefined1 (*) [32])&local_2960;
        local_2760 = mm_lookupmask_pd._0_8_;
        uStack_2758 = mm_lookupmask_pd._8_8_;
        uStack_2750 = mm_lookupmask_pd._0_8_;
        uStack_2748 = mm_lookupmask_pd._8_8_;
        auVar190 = ZEXT3264(CONCAT428(0x3f800003,
                                      CONCAT424(0x3f800003,
                                                CONCAT420(0x3f800003,
                                                          CONCAT416(0x3f800003,
                                                                    CONCAT412(0x3f800003,
                                                                              CONCAT48(0x3f800003,
                                                                                                                                                                              
                                                  0x3f8000033f800003)))))));
LAB_005b61a2:
        pauVar96 = pauVar96 + -1;
        root.ptr = puVar99[-1];
        puVar99 = puVar99 + -1;
        if (root.ptr == 0xfffffffffffffff8) goto LAB_005b74b6;
        local_2d60 = *pauVar96;
        auVar144 = vcmpps_avx(local_2d60,local_2780,1);
        if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar144 >> 0x7f,0) == '\0') &&
              (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar144 >> 0xbf,0) == '\0') &&
            (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar144[0x1f]) {
LAB_005b74c7:
          iVar93 = 2;
        }
        else {
          uVar101 = vmovmskps_avx(auVar144);
          unaff_R15 = (Geometry *)CONCAT44((int)((ulong)unaff_R15 >> 0x20),uVar101);
          iVar93 = 0;
          if ((uint)POPCOUNT(uVar101) <= uVar98) {
            if (unaff_R15 != (Geometry *)0x0) {
              local_2c60 = auVar183._0_32_;
              local_2da8 = (Geometry *)ray;
              do {
                k = 0;
                for (pGVar32 = unaff_R15; ((ulong)pGVar32 & 1) == 0;
                    pGVar32 = (Geometry *)((ulong)pGVar32 >> 1 | 0x8000000000000000)) {
                  k = k + 1;
                }
                local_2d40._0_8_ = k;
                auVar134 = ZEXT1664(auVar134._0_16_);
                auVar165 = ZEXT1664(auVar165._0_16_);
                auVar174 = ZEXT1664(auVar174._0_16_);
                auVar179 = ZEXT1664(auVar179._0_16_);
                bVar102 = occluded1(This,bvh,root,k,&local_2da9,(RayK<8> *)local_2da8,
                                    (TravRayK<8,_true> *)&local_2920.field_0,context);
                if (bVar102) {
                  *(undefined4 *)(local_2c20 + local_2d40._0_8_ * 4) = 0xffffffff;
                }
                unaff_R15 = (Geometry *)((ulong)&unaff_R15[-1].field_0x5f & (ulong)unaff_R15);
                auVar183 = ZEXT3264(local_2c60);
                auVar185 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar190 = ZEXT3264(CONCAT428(0x3f800003,
                                              CONCAT424(0x3f800003,
                                                        CONCAT420(0x3f800003,
                                                                  CONCAT416(0x3f800003,
                                                                            CONCAT412(0x3f800003,
                                                                                      CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                ray = (RayK<8> *)local_2da8;
              } while (unaff_R15 != (Geometry *)0x0);
            }
            auVar144 = _DAT_0205a980 & ~local_2c20;
            iVar93 = 3;
            if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar144 >> 0x7f,0) != '\0') ||
                  (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar144 >> 0xbf,0) != '\0') ||
                (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar144[0x1f] < '\0') {
              auVar134 = ZEXT3264(local_2780);
              auVar144._8_4_ = 0xff800000;
              auVar144._0_8_ = 0xff800000ff800000;
              auVar144._12_4_ = 0xff800000;
              auVar144._16_4_ = 0xff800000;
              auVar144._20_4_ = 0xff800000;
              auVar144._24_4_ = 0xff800000;
              auVar144._28_4_ = 0xff800000;
              local_2780 = vblendvps_avx(local_2780,auVar144,local_2c20);
              iVar93 = 2;
            }
          }
          if (uVar98 < (uint)POPCOUNT(uVar101)) {
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_005b74b6;
                auVar144 = vcmpps_avx(local_2780,local_2d60,6);
                if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar144 >> 0x7f,0) == '\0') &&
                      (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar144 >> 0xbf,0) == '\0') &&
                    (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar144[0x1f]) goto LAB_005b74c7;
                auVar97 = (undefined1  [8])((ulong)((uint)root.ptr & 0xf) - 8);
                if (auVar97 == (undefined1  [8])0x0) {
                  auVar144 = vpcmpeqd_avx2(auVar134._0_32_,auVar134._0_32_);
                  auVar118 = local_2c20;
                  goto LAB_005b7478;
                }
                auVar126._0_8_ = local_2c20._0_8_ ^ 0xffffffffffffffff;
                auVar126._8_4_ = local_2c20._8_4_ ^ 0xffffffff;
                auVar126._12_4_ = local_2c20._12_4_ ^ 0xffffffff;
                auVar126._16_4_ = local_2c20._16_4_ ^ 0xffffffff;
                auVar126._20_4_ = local_2c20._20_4_ ^ 0xffffffff;
                auVar126._24_4_ = local_2c20._24_4_ ^ 0xffffffff;
                auVar126._28_4_ = local_2c20._28_4_ ^ 0xffffffff;
                lVar95 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                uVar94 = 0;
                local_2c60 = auVar183._0_32_;
                goto LAB_005b63e3;
              }
              auVar193 = ZEXT3264(auVar185._0_32_);
              uVar94 = 0;
              uVar100 = 8;
              do {
                uVar19 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar94 * 8);
                if (uVar19 != 8) {
                  uVar101 = *(undefined4 *)(root.ptr + 0x20 + uVar94 * 4);
                  auVar104._4_4_ = uVar101;
                  auVar104._0_4_ = uVar101;
                  auVar104._8_4_ = uVar101;
                  auVar104._12_4_ = uVar101;
                  auVar104._16_4_ = uVar101;
                  auVar104._20_4_ = uVar101;
                  auVar104._24_4_ = uVar101;
                  auVar104._28_4_ = uVar101;
                  auVar84._8_8_ = local_2920._8_8_;
                  auVar84._0_8_ = local_2920._0_8_;
                  auVar84._16_8_ = local_2920._16_8_;
                  auVar84._24_8_ = local_2920._24_8_;
                  auVar85._8_8_ = local_2920._40_8_;
                  auVar85._0_8_ = local_2920._32_8_;
                  auVar85._16_8_ = local_2920._48_8_;
                  auVar85._24_8_ = local_2920._56_8_;
                  auVar86._8_8_ = local_2920._72_8_;
                  auVar86._0_8_ = local_2920._64_8_;
                  auVar86._16_8_ = local_2920._80_8_;
                  auVar86._24_8_ = local_2920._88_8_;
                  auVar144 = vsubps_avx(auVar104,auVar84);
                  auVar166._0_4_ = (float)local_2860._0_4_ * auVar144._0_4_;
                  auVar166._4_4_ = (float)local_2860._4_4_ * auVar144._4_4_;
                  auVar166._8_4_ = fStack_2858 * auVar144._8_4_;
                  auVar166._12_4_ = fStack_2854 * auVar144._12_4_;
                  auVar166._16_4_ = fStack_2850 * auVar144._16_4_;
                  auVar166._20_4_ = fStack_284c * auVar144._20_4_;
                  auVar166._28_36_ = auVar165._28_36_;
                  auVar166._24_4_ = fStack_2848 * auVar144._24_4_;
                  auVar160 = auVar166._0_32_;
                  auVar165 = ZEXT3264(auVar160);
                  uVar101 = *(undefined4 *)(root.ptr + 0x40 + uVar94 * 4);
                  auVar105._4_4_ = uVar101;
                  auVar105._0_4_ = uVar101;
                  auVar105._8_4_ = uVar101;
                  auVar105._12_4_ = uVar101;
                  auVar105._16_4_ = uVar101;
                  auVar105._20_4_ = uVar101;
                  auVar105._24_4_ = uVar101;
                  auVar105._28_4_ = uVar101;
                  auVar144 = vsubps_avx(auVar105,auVar85);
                  auVar175._0_4_ = (float)local_2840._0_4_ * auVar144._0_4_;
                  auVar175._4_4_ = (float)local_2840._4_4_ * auVar144._4_4_;
                  auVar175._8_4_ = fStack_2838 * auVar144._8_4_;
                  auVar175._12_4_ = fStack_2834 * auVar144._12_4_;
                  auVar175._16_4_ = fStack_2830 * auVar144._16_4_;
                  auVar175._20_4_ = fStack_282c * auVar144._20_4_;
                  auVar175._28_36_ = auVar174._28_36_;
                  auVar175._24_4_ = fStack_2828 * auVar144._24_4_;
                  auVar161 = auVar175._0_32_;
                  auVar174 = ZEXT3264(auVar161);
                  uVar101 = *(undefined4 *)(root.ptr + 0x60 + uVar94 * 4);
                  auVar106._4_4_ = uVar101;
                  auVar106._0_4_ = uVar101;
                  auVar106._8_4_ = uVar101;
                  auVar106._12_4_ = uVar101;
                  auVar106._16_4_ = uVar101;
                  auVar106._20_4_ = uVar101;
                  auVar106._24_4_ = uVar101;
                  auVar106._28_4_ = uVar101;
                  auVar144 = vsubps_avx(auVar106,auVar86);
                  auVar180._0_4_ = local_2820._0_4_ * auVar144._0_4_;
                  auVar180._4_4_ = local_2820._4_4_ * auVar144._4_4_;
                  auVar180._8_4_ = local_2820._8_4_ * auVar144._8_4_;
                  auVar180._12_4_ = local_2820._12_4_ * auVar144._12_4_;
                  auVar180._16_4_ = local_2820._16_4_ * auVar144._16_4_;
                  auVar180._20_4_ = local_2820._20_4_ * auVar144._20_4_;
                  auVar180._28_36_ = auVar179._28_36_;
                  auVar180._24_4_ = local_2820._24_4_ * auVar144._24_4_;
                  auVar139 = auVar180._0_32_;
                  auVar179 = ZEXT3264(auVar139);
                  uVar101 = *(undefined4 *)(root.ptr + 0x30 + uVar94 * 4);
                  auVar107._4_4_ = uVar101;
                  auVar107._0_4_ = uVar101;
                  auVar107._8_4_ = uVar101;
                  auVar107._12_4_ = uVar101;
                  auVar107._16_4_ = uVar101;
                  auVar107._20_4_ = uVar101;
                  auVar107._24_4_ = uVar101;
                  auVar107._28_4_ = uVar101;
                  auVar144 = vsubps_avx(auVar107,auVar84);
                  auVar36._4_4_ = (float)local_2860._4_4_ * auVar144._4_4_;
                  auVar36._0_4_ = (float)local_2860._0_4_ * auVar144._0_4_;
                  auVar36._8_4_ = fStack_2858 * auVar144._8_4_;
                  auVar36._12_4_ = fStack_2854 * auVar144._12_4_;
                  auVar36._16_4_ = fStack_2850 * auVar144._16_4_;
                  auVar36._20_4_ = fStack_284c * auVar144._20_4_;
                  auVar36._24_4_ = fStack_2848 * auVar144._24_4_;
                  auVar36._28_4_ = (int)((ulong)local_2920._24_8_ >> 0x20);
                  uVar101 = *(undefined4 *)(root.ptr + 0x50 + uVar94 * 4);
                  auVar108._4_4_ = uVar101;
                  auVar108._0_4_ = uVar101;
                  auVar108._8_4_ = uVar101;
                  auVar108._12_4_ = uVar101;
                  auVar108._16_4_ = uVar101;
                  auVar108._20_4_ = uVar101;
                  auVar108._24_4_ = uVar101;
                  auVar108._28_4_ = uVar101;
                  auVar144 = vsubps_avx(auVar108,auVar85);
                  auVar37._4_4_ = (float)local_2840._4_4_ * auVar144._4_4_;
                  auVar37._0_4_ = (float)local_2840._0_4_ * auVar144._0_4_;
                  auVar37._8_4_ = fStack_2838 * auVar144._8_4_;
                  auVar37._12_4_ = fStack_2834 * auVar144._12_4_;
                  auVar37._16_4_ = fStack_2830 * auVar144._16_4_;
                  auVar37._20_4_ = fStack_282c * auVar144._20_4_;
                  auVar37._24_4_ = fStack_2828 * auVar144._24_4_;
                  auVar37._28_4_ = (int)((ulong)local_2920._56_8_ >> 0x20);
                  uVar101 = *(undefined4 *)(root.ptr + 0x70 + uVar94 * 4);
                  auVar109._4_4_ = uVar101;
                  auVar109._0_4_ = uVar101;
                  auVar109._8_4_ = uVar101;
                  auVar109._12_4_ = uVar101;
                  auVar109._16_4_ = uVar101;
                  auVar109._20_4_ = uVar101;
                  auVar109._24_4_ = uVar101;
                  auVar109._28_4_ = uVar101;
                  auVar144 = vsubps_avx(auVar109,auVar86);
                  auVar38._4_4_ = local_2820._4_4_ * auVar144._4_4_;
                  auVar38._0_4_ = local_2820._0_4_ * auVar144._0_4_;
                  auVar38._8_4_ = local_2820._8_4_ * auVar144._8_4_;
                  auVar38._12_4_ = local_2820._12_4_ * auVar144._12_4_;
                  auVar38._16_4_ = local_2820._16_4_ * auVar144._16_4_;
                  auVar38._20_4_ = local_2820._20_4_ * auVar144._20_4_;
                  auVar38._24_4_ = local_2820._24_4_ * auVar144._24_4_;
                  auVar38._28_4_ = (int)((ulong)local_2920._88_8_ >> 0x20);
                  auVar144 = vminps_avx(auVar160,auVar36);
                  auVar138 = vminps_avx(auVar161,auVar37);
                  auVar144 = vmaxps_avx(auVar144,auVar138);
                  auVar138 = vminps_avx(auVar139,auVar38);
                  auVar144 = vmaxps_avx(auVar144,auVar138);
                  auVar39._4_4_ = auVar144._4_4_ * 0.99999964;
                  auVar39._0_4_ = auVar144._0_4_ * 0.99999964;
                  auVar39._8_4_ = auVar144._8_4_ * 0.99999964;
                  auVar39._12_4_ = auVar144._12_4_ * 0.99999964;
                  auVar39._16_4_ = auVar144._16_4_ * 0.99999964;
                  auVar39._20_4_ = auVar144._20_4_ * 0.99999964;
                  auVar39._24_4_ = auVar144._24_4_ * 0.99999964;
                  auVar39._28_4_ = auVar144._28_4_;
                  auVar144 = vmaxps_avx(auVar160,auVar36);
                  auVar138 = vmaxps_avx(auVar161,auVar37);
                  auVar138 = vminps_avx(auVar144,auVar138);
                  auVar144 = vmaxps_avx(auVar139,auVar38);
                  auVar144 = vminps_avx(auVar138,auVar144);
                  auVar40._4_4_ = auVar190._4_4_ * auVar144._4_4_;
                  auVar40._0_4_ = auVar190._0_4_ * auVar144._0_4_;
                  auVar40._8_4_ = auVar190._8_4_ * auVar144._8_4_;
                  auVar40._12_4_ = auVar190._12_4_ * auVar144._12_4_;
                  auVar40._16_4_ = auVar190._16_4_ * auVar144._16_4_;
                  auVar40._20_4_ = auVar190._20_4_ * auVar144._20_4_;
                  auVar40._24_4_ = auVar190._24_4_ * auVar144._24_4_;
                  auVar40._28_4_ = auVar144._28_4_;
                  auVar144 = vmaxps_avx(auVar39,local_27a0);
                  auVar138 = vminps_avx(auVar40,local_2780);
                  auVar144 = vcmpps_avx(auVar144,auVar138,2);
                  auVar134 = ZEXT3264(auVar144);
                  if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar144 >> 0x7f,0) != '\0') ||
                        (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar144 >> 0xbf,0) != '\0') ||
                      (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar144[0x1f] < '\0') {
                    auVar144 = vblendvps_avx(auVar185._0_32_,auVar39,auVar144);
                    if (uVar100 != 8) {
                      *puVar99 = uVar100;
                      puVar99 = puVar99 + 1;
                      *pauVar96 = auVar193._0_32_;
                      pauVar96 = pauVar96 + 1;
                    }
                    auVar193 = ZEXT3264(auVar144);
                    uVar100 = uVar19;
                  }
                }
                local_2d60 = auVar193._0_32_;
              } while ((uVar19 != 8) && (bVar102 = uVar94 < 3, uVar94 = uVar94 + 1, bVar102));
              iVar93 = 0;
              if (uVar100 == 8) {
LAB_005b6381:
                bVar102 = false;
                iVar93 = 4;
              }
              else {
                auVar144 = vcmpps_avx(local_2780,local_2d60,6);
                uVar101 = vmovmskps_avx(auVar144);
                bVar102 = true;
                if ((uint)POPCOUNT(uVar101) <= uVar98) {
                  *puVar99 = uVar100;
                  puVar99 = puVar99 + 1;
                  *pauVar96 = local_2d60;
                  pauVar96 = pauVar96 + 1;
                  goto LAB_005b6381;
                }
              }
              root.ptr = uVar100;
            } while (bVar102);
          }
        }
        goto LAB_005b74b9;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar94 = local_2c70 + 1;
    lVar95 = lVar95 + 0xe0;
    auVar138 = auVar126;
    if ((ulong)auVar97 <= uVar94) break;
LAB_005b63e3:
    local_2c68 = uVar94 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    uVar100 = 0;
    local_2ce0 = auVar126;
    local_2c70 = uVar94;
    auVar144 = auVar126;
    while( true ) {
      uVar18 = *(uint *)(lVar95 + uVar100 * 4);
      if ((ulong)uVar18 == 0xffffffff) break;
      uVar101 = *(undefined4 *)(lVar95 + -0xc0 + uVar100 * 4);
      auVar110._4_4_ = uVar101;
      auVar110._0_4_ = uVar101;
      auVar110._8_4_ = uVar101;
      auVar110._12_4_ = uVar101;
      auVar110._16_4_ = uVar101;
      auVar110._20_4_ = uVar101;
      auVar110._24_4_ = uVar101;
      auVar110._28_4_ = uVar101;
      uVar101 = *(undefined4 *)(lVar95 + -0xb0 + uVar100 * 4);
      auVar136._4_4_ = uVar101;
      auVar136._0_4_ = uVar101;
      auVar136._8_4_ = uVar101;
      auVar136._12_4_ = uVar101;
      auVar136._16_4_ = uVar101;
      auVar136._20_4_ = uVar101;
      auVar136._24_4_ = uVar101;
      auVar136._28_4_ = uVar101;
      uVar101 = *(undefined4 *)(lVar95 + -0xa0 + uVar100 * 4);
      auVar189._4_4_ = uVar101;
      auVar189._0_4_ = uVar101;
      auVar189._8_4_ = uVar101;
      auVar189._12_4_ = uVar101;
      auVar189._16_4_ = uVar101;
      auVar189._20_4_ = uVar101;
      auVar189._24_4_ = uVar101;
      auVar189._28_4_ = uVar101;
      uVar1 = *(undefined4 *)(lVar95 + -0x90 + uVar100 * 4);
      local_2b60._4_4_ = uVar1;
      local_2b60._0_4_ = uVar1;
      local_2b60._8_4_ = uVar1;
      local_2b60._12_4_ = uVar1;
      local_2b60._16_4_ = uVar1;
      local_2b60._20_4_ = uVar1;
      local_2b60._24_4_ = uVar1;
      local_2b60._28_4_ = uVar1;
      local_2c40._4_4_ = *(undefined4 *)(lVar95 + -0x80 + uVar100 * 4);
      local_2c40._0_4_ = local_2c40._4_4_;
      fStack_2c38 = (float)local_2c40._4_4_;
      fStack_2c34 = (float)local_2c40._4_4_;
      fStack_2c30 = (float)local_2c40._4_4_;
      fStack_2c2c = (float)local_2c40._4_4_;
      fStack_2c28 = (float)local_2c40._4_4_;
      uStack_2c24 = local_2c40._4_4_;
      uVar2 = *(undefined4 *)(lVar95 + -0x70 + uVar100 * 4);
      local_2b80._4_4_ = uVar2;
      local_2b80._0_4_ = uVar2;
      local_2b80._8_4_ = uVar2;
      local_2b80._12_4_ = uVar2;
      local_2b80._16_4_ = uVar2;
      local_2b80._20_4_ = uVar2;
      local_2b80._24_4_ = uVar2;
      local_2b80._28_4_ = uVar2;
      local_2ba0._4_4_ = *(undefined4 *)(lVar95 + -0x60 + uVar100 * 4);
      local_2ba0._0_4_ = local_2ba0._4_4_;
      local_2ba0._8_4_ = local_2ba0._4_4_;
      local_2ba0._12_4_ = local_2ba0._4_4_;
      local_2ba0._16_4_ = local_2ba0._4_4_;
      local_2ba0._20_4_ = local_2ba0._4_4_;
      local_2ba0._24_4_ = local_2ba0._4_4_;
      local_2ba0._28_4_ = local_2ba0._4_4_;
      local_2bc0._4_4_ = *(undefined4 *)(lVar95 + -0x50 + uVar100 * 4);
      local_2bc0._0_4_ = local_2bc0._4_4_;
      local_2bc0._8_4_ = local_2bc0._4_4_;
      local_2bc0._12_4_ = local_2bc0._4_4_;
      local_2bc0._16_4_ = local_2bc0._4_4_;
      local_2bc0._20_4_ = local_2bc0._4_4_;
      local_2bc0._24_4_ = local_2bc0._4_4_;
      local_2bc0._28_4_ = local_2bc0._4_4_;
      local_2be0._4_4_ = *(undefined4 *)(lVar95 + -0x40 + uVar100 * 4);
      local_2be0._0_4_ = local_2be0._4_4_;
      local_2be0._8_4_ = local_2be0._4_4_;
      local_2be0._12_4_ = local_2be0._4_4_;
      local_2be0._16_4_ = local_2be0._4_4_;
      local_2be0._20_4_ = local_2be0._4_4_;
      local_2be0._24_4_ = local_2be0._4_4_;
      local_2be0._28_4_ = local_2be0._4_4_;
      uVar2 = *(undefined4 *)(lVar95 + -0x30 + uVar100 * 4);
      local_2640._4_4_ = uVar2;
      local_2640._0_4_ = uVar2;
      local_2640._8_4_ = uVar2;
      local_2640._12_4_ = uVar2;
      local_2640._16_4_ = uVar2;
      local_2640._20_4_ = uVar2;
      local_2640._24_4_ = uVar2;
      local_2640._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(lVar95 + -0x20 + uVar100 * 4);
      local_2660._4_4_ = uVar2;
      local_2660._0_4_ = uVar2;
      local_2660._8_4_ = uVar2;
      local_2660._12_4_ = uVar2;
      local_2660._16_4_ = uVar2;
      local_2660._20_4_ = uVar2;
      local_2660._24_4_ = uVar2;
      local_2660._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(lVar95 + -0x10 + uVar100 * 4);
      local_2680._4_4_ = uVar2;
      local_2680._0_4_ = uVar2;
      local_2680._8_4_ = uVar2;
      local_2680._12_4_ = uVar2;
      local_2680._16_4_ = uVar2;
      local_2680._20_4_ = uVar2;
      local_2680._24_4_ = uVar2;
      local_2680._28_4_ = uVar2;
      local_2bf0 = *(undefined8 *)(local_2c68 + 0xd0);
      uStack_2be8 = *(undefined8 *)(local_2c68 + 0xd8);
      auVar4._0_8_ = (((Geometry *)ray)->super_RefCount)._vptr_RefCount;
      auVar4._8_8_ = (((Geometry *)ray)->super_RefCount).refCounter;
      auVar4._16_8_ = ((Geometry *)ray)->device;
      auVar4._24_8_ = ((Geometry *)ray)->userPtr;
      auVar5._0_4_ = ((Geometry *)ray)->numPrimitives;
      auVar5._4_4_ = ((Geometry *)ray)->numTimeSteps;
      auVar5._8_4_ = ((Geometry *)ray)->fnumTimeSegments;
      auVar5._12_4_ = (((Geometry *)ray)->time_range).lower;
      auVar5._16_4_ = (((Geometry *)ray)->time_range).upper;
      auVar5._20_4_ = ((Geometry *)ray)->mask;
      auVar5._24_4_ = ((Geometry *)ray)->modCounter_;
      auVar5._28_4_ = ((Geometry *)ray)->field_8;
      auVar6._0_8_ = ((Geometry *)ray)->intersectionFilterN;
      auVar6._8_8_ = ((Geometry *)ray)->occlusionFilterN;
      auVar6._16_8_ = ((Geometry *)ray)->pointQueryFunc;
      auVar6._24_8_ = *(undefined8 *)&((Geometry *)ray)->field_0x58;
      local_2a80 = vsubps_avx(auVar110,auVar4);
      local_2aa0 = vsubps_avx(auVar136,auVar5);
      local_2ac0 = vsubps_avx(auVar189,auVar6);
      auVar138 = vsubps_avx(local_2660,auVar5);
      auVar160 = vsubps_avx(local_2680,auVar6);
      local_2b00 = vsubps_avx(auVar138,local_2aa0);
      local_2ae0 = vsubps_avx(auVar160,local_2ac0);
      auVar181._0_4_ = auVar138._0_4_ + local_2aa0._0_4_;
      auVar181._4_4_ = auVar138._4_4_ + local_2aa0._4_4_;
      auVar181._8_4_ = auVar138._8_4_ + local_2aa0._8_4_;
      auVar181._12_4_ = auVar138._12_4_ + local_2aa0._12_4_;
      auVar181._16_4_ = auVar138._16_4_ + local_2aa0._16_4_;
      auVar181._20_4_ = auVar138._20_4_ + local_2aa0._20_4_;
      auVar181._24_4_ = auVar138._24_4_ + local_2aa0._24_4_;
      auVar181._28_4_ = auVar138._28_4_ + local_2aa0._28_4_;
      fVar103 = local_2ac0._0_4_;
      auVar187._0_4_ = auVar160._0_4_ + fVar103;
      fVar120 = local_2ac0._4_4_;
      auVar187._4_4_ = auVar160._4_4_ + fVar120;
      fVar122 = local_2ac0._8_4_;
      auVar187._8_4_ = auVar160._8_4_ + fVar122;
      fVar124 = local_2ac0._12_4_;
      auVar187._12_4_ = auVar160._12_4_ + fVar124;
      fVar22 = local_2ac0._16_4_;
      auVar187._16_4_ = auVar160._16_4_ + fVar22;
      fVar23 = local_2ac0._20_4_;
      auVar187._20_4_ = auVar160._20_4_ + fVar23;
      fVar24 = local_2ac0._24_4_;
      auVar187._24_4_ = auVar160._24_4_ + fVar24;
      fVar146 = local_2ac0._28_4_;
      auVar187._28_4_ = auVar160._28_4_ + fVar146;
      auVar41._4_4_ = auVar181._4_4_ * local_2ae0._4_4_;
      auVar41._0_4_ = auVar181._0_4_ * local_2ae0._0_4_;
      auVar41._8_4_ = auVar181._8_4_ * local_2ae0._8_4_;
      auVar41._12_4_ = auVar181._12_4_ * local_2ae0._12_4_;
      auVar41._16_4_ = auVar181._16_4_ * local_2ae0._16_4_;
      auVar41._20_4_ = auVar181._20_4_ * local_2ae0._20_4_;
      auVar41._24_4_ = auVar181._24_4_ * local_2ae0._24_4_;
      auVar41._28_4_ = uVar101;
      auVar31 = vfmsub231ps_fma(auVar41,local_2b00,auVar187);
      auVar161 = vsubps_avx(local_2640,auVar4);
      local_2b20 = vsubps_avx(auVar161,local_2a80);
      auVar42._4_4_ = auVar187._4_4_ * local_2b20._4_4_;
      auVar42._0_4_ = auVar187._0_4_ * local_2b20._0_4_;
      auVar42._8_4_ = auVar187._8_4_ * local_2b20._8_4_;
      auVar42._12_4_ = auVar187._12_4_ * local_2b20._12_4_;
      auVar42._16_4_ = auVar187._16_4_ * local_2b20._16_4_;
      auVar42._20_4_ = auVar187._20_4_ * local_2b20._20_4_;
      auVar42._24_4_ = auVar187._24_4_ * local_2b20._24_4_;
      auVar42._28_4_ = auVar187._28_4_;
      auVar192._0_4_ = auVar161._0_4_ + local_2a80._0_4_;
      auVar192._4_4_ = auVar161._4_4_ + local_2a80._4_4_;
      auVar192._8_4_ = auVar161._8_4_ + local_2a80._8_4_;
      auVar192._12_4_ = auVar161._12_4_ + local_2a80._12_4_;
      auVar192._16_4_ = auVar161._16_4_ + local_2a80._16_4_;
      auVar192._20_4_ = auVar161._20_4_ + local_2a80._20_4_;
      auVar192._24_4_ = auVar161._24_4_ + local_2a80._24_4_;
      auVar192._28_4_ = auVar161._28_4_ + local_2a80._28_4_;
      auVar125 = vfmsub231ps_fma(auVar42,local_2ae0,auVar192);
      auVar43._4_4_ = auVar192._4_4_ * local_2b00._4_4_;
      auVar43._0_4_ = auVar192._0_4_ * local_2b00._0_4_;
      auVar43._8_4_ = auVar192._8_4_ * local_2b00._8_4_;
      auVar43._12_4_ = auVar192._12_4_ * local_2b00._12_4_;
      auVar43._16_4_ = auVar192._16_4_ * local_2b00._16_4_;
      auVar43._20_4_ = auVar192._20_4_ * local_2b00._20_4_;
      auVar43._24_4_ = auVar192._24_4_ * local_2b00._24_4_;
      auVar43._28_4_ = auVar192._28_4_;
      auVar33 = vfmsub231ps_fma(auVar43,local_2b20,auVar181);
      pGVar32 = (Geometry *)((long)ray + 0xc0);
      fVar148 = *(float *)&(pGVar32->super_RefCount)._vptr_RefCount;
      fVar150 = *(float *)((long)&(((Geometry *)((long)ray + 0xc0))->super_RefCount)._vptr_RefCount
                          + 4);
      fVar152 = *(float *)&(((Geometry *)((long)ray + 0xc0))->super_RefCount).refCounter.
                           super___atomic_base<unsigned_long>._M_i;
      fVar154 = *(float *)((long)&(((Geometry *)((long)ray + 0xc0))->super_RefCount).refCounter.
                                  super___atomic_base<unsigned_long>._M_i + 4);
      fVar29 = *(float *)&((Geometry *)((long)ray + 0xc0))->device;
      fVar30 = *(float *)((long)&((Geometry *)((long)ray + 0xc0))->device + 4);
      fVar135 = *(float *)&((Geometry *)((long)ray + 0xc0))->userPtr;
      auVar89 = *(undefined1 (*) [28])pGVar32;
      auVar90._0_8_ = (pGVar32->super_RefCount)._vptr_RefCount;
      auVar90._8_8_ = (pGVar32->super_RefCount).refCounter;
      auVar90._16_8_ = pGVar32->device;
      auVar90._24_8_ = pGVar32->userPtr;
      auVar44._4_4_ = auVar33._4_4_ * fVar150;
      auVar44._0_4_ = auVar33._0_4_ * fVar148;
      auVar44._8_4_ = auVar33._8_4_ * fVar152;
      auVar44._12_4_ = auVar33._12_4_ * fVar154;
      auVar44._16_4_ = fVar29 * 0.0;
      auVar44._20_4_ = fVar30 * 0.0;
      auVar44._24_4_ = fVar135 * 0.0;
      auVar44._28_4_ = local_2b20._28_4_;
      local_2a60._0_8_ = ((Geometry *)((long)ray + 0x60))->intersectionFilterN;
      local_2a60._8_8_ = ((Geometry *)((long)ray + 0x60))->occlusionFilterN;
      local_2a60._16_8_ = ((Geometry *)((long)ray + 0x60))->pointQueryFunc;
      local_2a60._24_8_ = *(undefined8 *)&((Geometry *)((long)ray + 0x60))->field_0x58;
      auVar125 = vfmadd231ps_fma(auVar44,local_2a60,ZEXT1632(auVar125));
      auVar92._0_4_ = ((Geometry *)((long)ray + 0x60))->numPrimitives;
      auVar92._4_4_ = ((Geometry *)((long)ray + 0x60))->numTimeSteps;
      auVar92._8_4_ = ((Geometry *)((long)ray + 0x60))->fnumTimeSegments;
      auVar92._12_4_ = (((Geometry *)((long)ray + 0x60))->time_range).lower;
      auVar92._16_4_ = (((Geometry *)((long)ray + 0x60))->time_range).upper;
      auVar92._20_4_ = ((Geometry *)((long)ray + 0x60))->mask;
      auVar92._24_4_ = ((Geometry *)((long)ray + 0x60))->modCounter_;
      auVar92._28_4_ = ((Geometry *)((long)ray + 0x60))->field_8;
      auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar92,ZEXT1632(auVar31));
      auVar139 = vsubps_avx(local_2b60,auVar4);
      auVar115 = vsubps_avx(_local_2c40,auVar5);
      auVar164 = vsubps_avx(local_2b80,auVar6);
      auVar129 = vsubps_avx(local_2aa0,auVar115);
      auVar113 = vsubps_avx(local_2ac0,auVar164);
      auVar167._0_4_ = local_2aa0._0_4_ + auVar115._0_4_;
      auVar167._4_4_ = local_2aa0._4_4_ + auVar115._4_4_;
      auVar167._8_4_ = local_2aa0._8_4_ + auVar115._8_4_;
      auVar167._12_4_ = local_2aa0._12_4_ + auVar115._12_4_;
      auVar167._16_4_ = local_2aa0._16_4_ + auVar115._16_4_;
      auVar167._20_4_ = local_2aa0._20_4_ + auVar115._20_4_;
      auVar167._24_4_ = local_2aa0._24_4_ + auVar115._24_4_;
      auVar167._28_4_ = local_2aa0._28_4_ + auVar115._28_4_;
      auVar178._0_4_ = fVar103 + auVar164._0_4_;
      auVar178._4_4_ = fVar120 + auVar164._4_4_;
      auVar178._8_4_ = fVar122 + auVar164._8_4_;
      auVar178._12_4_ = fVar124 + auVar164._12_4_;
      auVar178._16_4_ = fVar22 + auVar164._16_4_;
      auVar178._20_4_ = fVar23 + auVar164._20_4_;
      auVar178._24_4_ = fVar24 + auVar164._24_4_;
      auVar178._28_4_ = fVar146 + auVar164._28_4_;
      fVar194 = auVar113._0_4_;
      fVar195 = auVar113._4_4_;
      auVar45._4_4_ = fVar195 * auVar167._4_4_;
      auVar45._0_4_ = fVar194 * auVar167._0_4_;
      fVar196 = auVar113._8_4_;
      auVar45._8_4_ = fVar196 * auVar167._8_4_;
      fVar197 = auVar113._12_4_;
      auVar45._12_4_ = fVar197 * auVar167._12_4_;
      fVar198 = auVar113._16_4_;
      auVar45._16_4_ = fVar198 * auVar167._16_4_;
      fVar199 = auVar113._20_4_;
      auVar45._20_4_ = fVar199 * auVar167._20_4_;
      fVar200 = auVar113._24_4_;
      auVar45._24_4_ = fVar200 * auVar167._24_4_;
      auVar45._28_4_ = uVar1;
      auVar33 = vfmsub231ps_fma(auVar45,auVar129,auVar178);
      auVar184 = vsubps_avx(local_2a80,auVar139);
      fVar119 = auVar184._0_4_;
      fVar121 = auVar184._4_4_;
      auVar46._4_4_ = auVar178._4_4_ * fVar121;
      auVar46._0_4_ = auVar178._0_4_ * fVar119;
      fVar123 = auVar184._8_4_;
      auVar46._8_4_ = auVar178._8_4_ * fVar123;
      fVar25 = auVar184._12_4_;
      auVar46._12_4_ = auVar178._12_4_ * fVar25;
      fVar26 = auVar184._16_4_;
      auVar46._16_4_ = auVar178._16_4_ * fVar26;
      fVar27 = auVar184._20_4_;
      auVar46._20_4_ = auVar178._20_4_ * fVar27;
      fVar28 = auVar184._24_4_;
      auVar46._24_4_ = auVar178._24_4_ * fVar28;
      auVar46._28_4_ = auVar178._28_4_;
      auVar170._0_4_ = local_2a80._0_4_ + auVar139._0_4_;
      auVar170._4_4_ = local_2a80._4_4_ + auVar139._4_4_;
      auVar170._8_4_ = local_2a80._8_4_ + auVar139._8_4_;
      auVar170._12_4_ = local_2a80._12_4_ + auVar139._12_4_;
      auVar170._16_4_ = local_2a80._16_4_ + auVar139._16_4_;
      auVar170._20_4_ = local_2a80._20_4_ + auVar139._20_4_;
      auVar170._24_4_ = local_2a80._24_4_ + auVar139._24_4_;
      auVar170._28_4_ = local_2a80._28_4_ + auVar139._28_4_;
      auVar31 = vfmsub231ps_fma(auVar46,auVar113,auVar170);
      fVar145 = auVar129._0_4_;
      fVar147 = auVar129._4_4_;
      auVar47._4_4_ = fVar147 * auVar170._4_4_;
      auVar47._0_4_ = fVar145 * auVar170._0_4_;
      fVar149 = auVar129._8_4_;
      auVar47._8_4_ = fVar149 * auVar170._8_4_;
      fVar151 = auVar129._12_4_;
      auVar47._12_4_ = fVar151 * auVar170._12_4_;
      fVar153 = auVar129._16_4_;
      auVar47._16_4_ = fVar153 * auVar170._16_4_;
      fVar155 = auVar129._20_4_;
      auVar47._20_4_ = fVar155 * auVar170._20_4_;
      fVar191 = auVar129._24_4_;
      auVar47._24_4_ = fVar191 * auVar170._24_4_;
      auVar47._28_4_ = auVar170._28_4_;
      auVar34 = vfmsub231ps_fma(auVar47,auVar184,auVar167);
      auVar171._0_4_ = fVar148 * auVar34._0_4_;
      auVar171._4_4_ = fVar150 * auVar34._4_4_;
      auVar171._8_4_ = fVar152 * auVar34._8_4_;
      auVar171._12_4_ = fVar154 * auVar34._12_4_;
      auVar171._16_4_ = fVar29 * 0.0;
      auVar171._20_4_ = fVar30 * 0.0;
      auVar171._24_4_ = fVar135 * 0.0;
      auVar171._28_4_ = 0;
      auVar31 = vfmadd231ps_fma(auVar171,local_2a60,ZEXT1632(auVar31));
      auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),auVar92,ZEXT1632(auVar33));
      auVar174 = ZEXT1664(auVar31);
      auVar165 = ZEXT3264(local_2c60);
      auVar186 = vsubps_avx(auVar139,auVar161);
      auVar179 = ZEXT3264(auVar186);
      auVar111._0_4_ = auVar161._0_4_ + auVar139._0_4_;
      auVar111._4_4_ = auVar161._4_4_ + auVar139._4_4_;
      auVar111._8_4_ = auVar161._8_4_ + auVar139._8_4_;
      auVar111._12_4_ = auVar161._12_4_ + auVar139._12_4_;
      auVar111._16_4_ = auVar161._16_4_ + auVar139._16_4_;
      auVar111._20_4_ = auVar161._20_4_ + auVar139._20_4_;
      auVar111._24_4_ = auVar161._24_4_ + auVar139._24_4_;
      auVar111._28_4_ = auVar161._28_4_ + auVar139._28_4_;
      auVar139 = vsubps_avx(auVar115,auVar138);
      auVar127._0_4_ = auVar115._0_4_ + auVar138._0_4_;
      auVar127._4_4_ = auVar115._4_4_ + auVar138._4_4_;
      auVar127._8_4_ = auVar115._8_4_ + auVar138._8_4_;
      auVar127._12_4_ = auVar115._12_4_ + auVar138._12_4_;
      auVar127._16_4_ = auVar115._16_4_ + auVar138._16_4_;
      auVar127._20_4_ = auVar115._20_4_ + auVar138._20_4_;
      auVar127._24_4_ = auVar115._24_4_ + auVar138._24_4_;
      auVar127._28_4_ = auVar115._28_4_ + auVar138._28_4_;
      auVar115 = vsubps_avx(auVar164,auVar160);
      auVar137._0_4_ = auVar164._0_4_ + auVar160._0_4_;
      auVar137._4_4_ = auVar164._4_4_ + auVar160._4_4_;
      auVar137._8_4_ = auVar164._8_4_ + auVar160._8_4_;
      auVar137._12_4_ = auVar164._12_4_ + auVar160._12_4_;
      auVar137._16_4_ = auVar164._16_4_ + auVar160._16_4_;
      auVar137._20_4_ = auVar164._20_4_ + auVar160._20_4_;
      auVar137._24_4_ = auVar164._24_4_ + auVar160._24_4_;
      auVar137._28_4_ = auVar164._28_4_ + auVar160._28_4_;
      auVar48._4_4_ = auVar115._4_4_ * auVar127._4_4_;
      auVar48._0_4_ = auVar115._0_4_ * auVar127._0_4_;
      auVar48._8_4_ = auVar115._8_4_ * auVar127._8_4_;
      auVar48._12_4_ = auVar115._12_4_ * auVar127._12_4_;
      auVar48._16_4_ = auVar115._16_4_ * auVar127._16_4_;
      auVar48._20_4_ = auVar115._20_4_ * auVar127._20_4_;
      auVar48._24_4_ = auVar115._24_4_ * auVar127._24_4_;
      auVar48._28_4_ = fVar146;
      auVar34 = vfmsub231ps_fma(auVar48,auVar139,auVar137);
      auVar49._4_4_ = auVar186._4_4_ * auVar137._4_4_;
      auVar49._0_4_ = auVar186._0_4_ * auVar137._0_4_;
      auVar49._8_4_ = auVar186._8_4_ * auVar137._8_4_;
      auVar49._12_4_ = auVar186._12_4_ * auVar137._12_4_;
      auVar49._16_4_ = auVar186._16_4_ * auVar137._16_4_;
      auVar49._20_4_ = auVar186._20_4_ * auVar137._20_4_;
      auVar49._24_4_ = auVar186._24_4_ * auVar137._24_4_;
      auVar49._28_4_ = auVar137._28_4_;
      auVar33 = vfmsub231ps_fma(auVar49,auVar115,auVar111);
      auVar50._4_4_ = auVar111._4_4_ * auVar139._4_4_;
      auVar50._0_4_ = auVar111._0_4_ * auVar139._0_4_;
      auVar50._8_4_ = auVar111._8_4_ * auVar139._8_4_;
      auVar50._12_4_ = auVar111._12_4_ * auVar139._12_4_;
      auVar50._16_4_ = auVar111._16_4_ * auVar139._16_4_;
      auVar50._20_4_ = auVar111._20_4_ * auVar139._20_4_;
      auVar50._24_4_ = auVar111._24_4_ * auVar139._24_4_;
      auVar50._28_4_ = auVar111._28_4_;
      auVar35 = vfmsub231ps_fma(auVar50,auVar186,auVar127);
      auVar112._0_4_ = fVar148 * auVar35._0_4_;
      auVar112._4_4_ = fVar150 * auVar35._4_4_;
      auVar112._8_4_ = fVar152 * auVar35._8_4_;
      auVar112._12_4_ = fVar154 * auVar35._12_4_;
      auVar112._16_4_ = fVar29 * 0.0;
      auVar112._20_4_ = fVar30 * 0.0;
      auVar112._24_4_ = fVar135 * 0.0;
      auVar112._28_4_ = 0;
      auVar33 = vfmadd231ps_fma(auVar112,local_2a60,ZEXT1632(auVar33));
      auVar33 = vfmadd231ps_fma(ZEXT1632(auVar33),auVar92,ZEXT1632(auVar34));
      local_26e0 = ZEXT1632(CONCAT412(auVar33._12_4_ + auVar125._12_4_ + auVar31._12_4_,
                                      CONCAT48(auVar33._8_4_ + auVar125._8_4_ + auVar31._8_4_,
                                               CONCAT44(auVar33._4_4_ +
                                                        auVar125._4_4_ + auVar31._4_4_,
                                                        auVar33._0_4_ +
                                                        auVar125._0_4_ + auVar31._0_4_))));
      local_26a0 = ZEXT1632(auVar125);
      auVar138 = vminps_avx(local_26a0,ZEXT1632(auVar31));
      auVar138 = vminps_avx(auVar138,ZEXT1632(auVar33));
      local_2700 = vandps_avx(local_26e0,local_2c60);
      uVar94 = CONCAT44(local_2700._4_4_ * 1.1920929e-07,local_2700._0_4_ * 1.1920929e-07);
      fVar146 = local_2700._8_4_ * 1.1920929e-07;
      auVar51._8_4_ = fVar146;
      auVar51._0_8_ = uVar94;
      fVar148 = local_2700._12_4_ * 1.1920929e-07;
      auVar51._12_4_ = fVar148;
      fVar150 = local_2700._16_4_ * 1.1920929e-07;
      auVar51._16_4_ = fVar150;
      fVar152 = local_2700._20_4_ * 1.1920929e-07;
      auVar51._20_4_ = fVar152;
      fVar154 = local_2700._24_4_ * 1.1920929e-07;
      auVar51._24_4_ = fVar154;
      auVar51._28_4_ = 0x34000000;
      local_2d60._8_4_ = 0x80000000;
      local_2d60._0_8_ = 0x8000000080000000;
      local_2d60._12_4_ = 0x80000000;
      local_2d60._16_4_ = 0x80000000;
      local_2d60._20_4_ = 0x80000000;
      local_2d60._24_4_ = 0x80000000;
      local_2d60._28_4_ = 0x80000000;
      auVar156._0_8_ = uVar94 ^ 0x8000000080000000;
      auVar156._8_4_ = -fVar146;
      auVar156._12_4_ = -fVar148;
      auVar156._16_4_ = -fVar150;
      auVar156._20_4_ = -fVar152;
      auVar156._24_4_ = -fVar154;
      auVar156._28_4_ = 0xb4000000;
      auVar138 = vcmpps_avx(auVar138,auVar156,5);
      local_26c0 = ZEXT1632(auVar31);
      auVar161 = vmaxps_avx(local_26a0,ZEXT1632(auVar31));
      auVar160 = vmaxps_avx(auVar161,ZEXT1632(auVar33));
      auVar160 = vcmpps_avx(auVar160,auVar51,2);
      auVar160 = vorps_avx(auVar138,auVar160);
      auVar164 = auVar144 & auVar160;
      _local_2da0 = auVar90;
      local_2d40 = auVar144;
      if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar164 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar164 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar164 >> 0x7f,0) == '\0') &&
            (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar164 >> 0xbf,0) == '\0') &&
          (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar164[0x1f]) {
LAB_005b6fe6:
        auVar185 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar190 = ZEXT3264(CONCAT428(0x3f800003,
                                      CONCAT424(0x3f800003,
                                                CONCAT420(0x3f800003,
                                                          CONCAT416(0x3f800003,
                                                                    CONCAT412(0x3f800003,
                                                                              CONCAT48(0x3f800003,
                                                                                                                                                                              
                                                  0x3f8000033f800003)))))));
      }
      else {
        local_2b40 = auVar160;
        auVar52._4_4_ = fVar147 * local_2ae0._4_4_;
        auVar52._0_4_ = fVar145 * local_2ae0._0_4_;
        auVar52._8_4_ = fVar149 * local_2ae0._8_4_;
        auVar52._12_4_ = fVar151 * local_2ae0._12_4_;
        auVar52._16_4_ = fVar153 * local_2ae0._16_4_;
        auVar52._20_4_ = fVar155 * local_2ae0._20_4_;
        auVar52._24_4_ = fVar191 * local_2ae0._24_4_;
        auVar52._28_4_ = auVar160._28_4_;
        auVar53._4_4_ = fVar121 * local_2b00._4_4_;
        auVar53._0_4_ = fVar119 * local_2b00._0_4_;
        auVar53._8_4_ = fVar123 * local_2b00._8_4_;
        auVar53._12_4_ = fVar25 * local_2b00._12_4_;
        auVar53._16_4_ = fVar26 * local_2b00._16_4_;
        auVar53._20_4_ = fVar27 * local_2b00._20_4_;
        auVar53._24_4_ = fVar28 * local_2b00._24_4_;
        auVar53._28_4_ = auVar138._28_4_;
        auVar33 = vfmsub213ps_fma(local_2b00,auVar113,auVar52);
        auVar54._4_4_ = fVar195 * auVar139._4_4_;
        auVar54._0_4_ = fVar194 * auVar139._0_4_;
        auVar54._8_4_ = fVar196 * auVar139._8_4_;
        auVar54._12_4_ = fVar197 * auVar139._12_4_;
        auVar54._16_4_ = fVar198 * auVar139._16_4_;
        auVar54._20_4_ = fVar199 * auVar139._20_4_;
        auVar54._24_4_ = fVar200 * auVar139._24_4_;
        auVar54._28_4_ = 0x34000000;
        auVar55._4_4_ = fVar121 * auVar115._4_4_;
        auVar55._0_4_ = fVar119 * auVar115._0_4_;
        auVar55._8_4_ = fVar123 * auVar115._8_4_;
        auVar55._12_4_ = fVar25 * auVar115._12_4_;
        auVar55._16_4_ = fVar26 * auVar115._16_4_;
        auVar55._20_4_ = fVar27 * auVar115._20_4_;
        auVar55._24_4_ = fVar28 * auVar115._24_4_;
        auVar55._28_4_ = auVar161._28_4_;
        auVar34 = vfmsub213ps_fma(auVar115,auVar129,auVar54);
        auVar138 = vandps_avx(auVar52,local_2c60);
        auVar161 = vandps_avx(auVar54,local_2c60);
        auVar138 = vcmpps_avx(auVar138,auVar161,1);
        auVar115 = vblendvps_avx(ZEXT1632(auVar34),ZEXT1632(auVar33),auVar138);
        auVar56._4_4_ = auVar186._4_4_ * fVar147;
        auVar56._0_4_ = auVar186._0_4_ * fVar145;
        auVar56._8_4_ = auVar186._8_4_ * fVar149;
        auVar56._12_4_ = auVar186._12_4_ * fVar151;
        auVar56._16_4_ = auVar186._16_4_ * fVar153;
        auVar56._20_4_ = auVar186._20_4_ * fVar155;
        auVar56._24_4_ = auVar186._24_4_ * fVar191;
        auVar56._28_4_ = auVar138._28_4_;
        auVar33 = vfmsub213ps_fma(auVar186,auVar113,auVar55);
        auVar179 = ZEXT1664(auVar33);
        auVar57._4_4_ = fVar195 * local_2b20._4_4_;
        auVar57._0_4_ = fVar194 * local_2b20._0_4_;
        auVar57._8_4_ = fVar196 * local_2b20._8_4_;
        auVar57._12_4_ = fVar197 * local_2b20._12_4_;
        auVar57._16_4_ = fVar198 * local_2b20._16_4_;
        auVar57._20_4_ = fVar199 * local_2b20._20_4_;
        auVar57._24_4_ = fVar200 * local_2b20._24_4_;
        auVar57._28_4_ = auVar161._28_4_;
        auVar34 = vfmsub213ps_fma(local_2ae0,auVar184,auVar57);
        auVar138 = vandps_avx(auVar57,local_2c60);
        auVar161 = vandps_avx(auVar55,local_2c60);
        auVar138 = vcmpps_avx(auVar138,auVar161,1);
        auVar164 = vblendvps_avx(ZEXT1632(auVar33),ZEXT1632(auVar34),auVar138);
        auVar165 = ZEXT3264(auVar164);
        auVar33 = vfmsub213ps_fma(local_2b20,auVar129,auVar53);
        auVar34 = vfmsub213ps_fma(auVar139,auVar184,auVar56);
        auVar138 = vandps_avx(local_2c60,auVar53);
        auVar161 = vandps_avx(local_2c60,auVar56);
        auVar139 = vcmpps_avx(auVar138,auVar161,1);
        auVar161 = vblendvps_avx(ZEXT1632(auVar34),ZEXT1632(auVar33),auVar139);
        local_2da0._0_4_ = auVar89._0_4_;
        local_2da0._4_4_ = auVar89._4_4_;
        auStack_2d98._0_4_ = auVar89._8_4_;
        auStack_2d98._4_4_ = auVar89._12_4_;
        fStack_2d90 = auVar89._16_4_;
        fStack_2d8c = auVar89._20_4_;
        fStack_2d88 = auVar89._24_4_;
        auVar58._4_4_ = auVar161._4_4_ * (float)local_2da0._4_4_;
        auVar58._0_4_ = auVar161._0_4_ * (float)local_2da0._0_4_;
        auVar58._8_4_ = auVar161._8_4_ * (float)auStack_2d98._0_4_;
        auVar58._12_4_ = auVar161._12_4_ * (float)auStack_2d98._4_4_;
        auVar58._16_4_ = auVar161._16_4_ * fStack_2d90;
        auVar58._20_4_ = auVar161._20_4_ * fStack_2d8c;
        auVar58._24_4_ = auVar161._24_4_ * fStack_2d88;
        auVar58._28_4_ = auVar139._28_4_;
        auVar33 = vfmadd213ps_fma(local_2a60,auVar164,auVar58);
        auVar33 = vfmadd213ps_fma(auVar92,auVar115,ZEXT1632(auVar33));
        fVar146 = auVar33._0_4_ + auVar33._0_4_;
        fVar119 = auVar33._4_4_ + auVar33._4_4_;
        fVar121 = auVar33._8_4_ + auVar33._8_4_;
        fVar123 = auVar33._12_4_ + auVar33._12_4_;
        auVar113 = ZEXT1632(CONCAT412(fVar123,CONCAT48(fVar121,CONCAT44(fVar119,fVar146))));
        auVar59._4_4_ = auVar161._4_4_ * fVar120;
        auVar59._0_4_ = auVar161._0_4_ * fVar103;
        auVar59._8_4_ = auVar161._8_4_ * fVar122;
        auVar59._12_4_ = auVar161._12_4_ * fVar124;
        auVar59._16_4_ = auVar161._16_4_ * fVar22;
        auVar59._20_4_ = auVar161._20_4_ * fVar23;
        auVar59._24_4_ = auVar161._24_4_ * fVar24;
        auVar59._28_4_ = auVar138._28_4_;
        auVar33 = vfmadd213ps_fma(local_2aa0,auVar164,auVar59);
        auVar34 = vfmadd213ps_fma(local_2a80,auVar115,ZEXT1632(auVar33));
        auVar138 = vrcpps_avx(auVar113);
        auVar162._8_4_ = 0x3f800000;
        auVar162._0_8_ = &DAT_3f8000003f800000;
        auVar162._12_4_ = 0x3f800000;
        auVar162._16_4_ = 0x3f800000;
        auVar162._20_4_ = 0x3f800000;
        auVar162._24_4_ = 0x3f800000;
        auVar162._28_4_ = 0x3f800000;
        auVar33 = vfnmadd213ps_fma(auVar138,auVar113,auVar162);
        auVar33 = vfmadd132ps_fma(ZEXT1632(auVar33),auVar138,auVar138);
        auVar129 = ZEXT1632(CONCAT412((auVar34._12_4_ + auVar34._12_4_) * auVar33._12_4_,
                                      CONCAT48((auVar34._8_4_ + auVar34._8_4_) * auVar33._8_4_,
                                               CONCAT44((auVar34._4_4_ + auVar34._4_4_) *
                                                        auVar33._4_4_,
                                                        (auVar34._0_4_ + auVar34._0_4_) *
                                                        auVar33._0_4_))));
        auVar7._0_8_ = (((Geometry *)((long)ray + 0x60))->super_RefCount)._vptr_RefCount;
        auVar7._8_8_ = (((Geometry *)((long)ray + 0x60))->super_RefCount).refCounter;
        auVar7._16_8_ = ((Geometry *)((long)ray + 0x60))->device;
        auVar7._24_8_ = ((Geometry *)((long)ray + 0x60))->userPtr;
        local_2cc0._0_8_ = ((Geometry *)((long)ray + 0xc0))->intersectionFilterN;
        local_2cc0._8_8_ = ((Geometry *)((long)ray + 0xc0))->occlusionFilterN;
        local_2cc0._16_8_ = ((Geometry *)((long)ray + 0xc0))->pointQueryFunc;
        local_2cc0._24_8_ = *(undefined8 *)&((Geometry *)((long)ray + 0xc0))->field_0x58;
        auVar138 = vcmpps_avx(auVar7,auVar129,2);
        auVar139 = vcmpps_avx(auVar129,local_2cc0,2);
        auVar138 = vandps_avx(auVar138,auVar139);
        auVar174 = ZEXT3264(local_2d60);
        auVar157._0_8_ = CONCAT44(fVar119,fVar146) ^ 0x8000000080000000;
        auVar157._8_4_ = -fVar121;
        auVar157._12_4_ = -fVar123;
        auVar157._16_4_ = 0x80000000;
        auVar157._20_4_ = 0x80000000;
        auVar157._24_4_ = 0x80000000;
        auVar157._28_4_ = 0x80000000;
        auVar139 = vcmpps_avx(auVar113,auVar157,4);
        auVar138 = vandps_avx(auVar139,auVar138);
        auVar160 = vandps_avx(auVar144,auVar160);
        auVar138 = vpslld_avx2(auVar138,0x1f);
        auVar139 = vpsrad_avx2(auVar138,0x1f);
        auVar138 = auVar160 & auVar139;
        if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar138 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar138 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar138 >> 0x7f,0) == '\0') &&
              (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar138 >> 0xbf,0) == '\0') &&
            (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar138[0x1f]) goto LAB_005b6fe6;
        auVar138 = vandps_avx(auVar139,auVar160);
        unaff_R15 = (context->scene->geometries).items[uVar18].ptr;
        uVar3 = unaff_R15->mask;
        auVar140._4_4_ = uVar3;
        auVar140._0_4_ = uVar3;
        auVar140._8_4_ = uVar3;
        auVar140._12_4_ = uVar3;
        auVar140._16_4_ = uVar3;
        auVar140._20_4_ = uVar3;
        auVar140._24_4_ = uVar3;
        auVar140._28_4_ = uVar3;
        auVar8._0_8_ = (((Geometry *)((long)ray + 0x120))->super_RefCount)._vptr_RefCount;
        auVar8._8_8_ = (((Geometry *)((long)ray + 0x120))->super_RefCount).refCounter;
        auVar8._16_8_ = ((Geometry *)((long)ray + 0x120))->device;
        auVar8._24_8_ = ((Geometry *)((long)ray + 0x120))->userPtr;
        auVar160 = vpand_avx2(auVar140,auVar8);
        auVar139 = vpcmpeqd_avx2(auVar160,_DAT_02020f00);
        auVar160 = auVar138 & ~auVar139;
        auVar185 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar190 = ZEXT3264(CONCAT428(0x3f800003,
                                      CONCAT424(0x3f800003,
                                                CONCAT420(0x3f800003,
                                                          CONCAT416(0x3f800003,
                                                                    CONCAT412(0x3f800003,
                                                                              CONCAT48(0x3f800003,
                                                                                                                                                                              
                                                  0x3f8000033f800003)))))));
        if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar160 >> 0x7f,0) != '\0') ||
              (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar160 >> 0xbf,0) != '\0') ||
            (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar160[0x1f] < '\0') {
          uVar101 = *(undefined4 *)((long)&local_2bf0 + uVar100 * 4);
          auVar144 = vandnps_avx(auVar139,auVar138);
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (unaff_R15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar138 = vrcpps_avx(local_26e0);
            auVar168._8_4_ = 0x3f800000;
            auVar168._0_8_ = &DAT_3f8000003f800000;
            auVar168._12_4_ = 0x3f800000;
            auVar168._16_4_ = 0x3f800000;
            auVar168._20_4_ = 0x3f800000;
            auVar168._24_4_ = 0x3f800000;
            auVar168._28_4_ = 0x3f800000;
            auVar33 = vfnmadd213ps_fma(local_26e0,auVar138,auVar168);
            auVar33 = vfmadd132ps_fma(ZEXT1632(auVar33),auVar138,auVar138);
            auVar116._8_4_ = 0x219392ef;
            auVar116._0_8_ = 0x219392ef219392ef;
            auVar116._12_4_ = 0x219392ef;
            auVar116._16_4_ = 0x219392ef;
            auVar116._20_4_ = 0x219392ef;
            auVar116._24_4_ = 0x219392ef;
            auVar116._28_4_ = 0x219392ef;
            auVar138 = vcmpps_avx(local_2700,auVar116,5);
            auVar138 = vandps_avx(auVar138,ZEXT1632(auVar33));
            auVar80._4_4_ = auVar138._4_4_ * auVar125._4_4_;
            auVar80._0_4_ = auVar138._0_4_ * auVar125._0_4_;
            auVar80._8_4_ = auVar138._8_4_ * auVar125._8_4_;
            auVar80._12_4_ = auVar138._12_4_ * auVar125._12_4_;
            auVar80._16_4_ = auVar138._16_4_ * 0.0;
            auVar80._20_4_ = auVar138._20_4_ * 0.0;
            auVar80._24_4_ = auVar138._24_4_ * 0.0;
            auVar80._28_4_ = local_2700._28_4_;
            auVar160 = vminps_avx(auVar80,auVar168);
            auVar81._4_4_ = auVar138._4_4_ * auVar31._4_4_;
            auVar81._0_4_ = auVar138._0_4_ * auVar31._0_4_;
            auVar81._8_4_ = auVar138._8_4_ * auVar31._8_4_;
            auVar81._12_4_ = auVar138._12_4_ * auVar31._12_4_;
            auVar81._16_4_ = auVar138._16_4_ * 0.0;
            auVar81._20_4_ = auVar138._20_4_ * 0.0;
            auVar81._24_4_ = auVar138._24_4_ * 0.0;
            auVar81._28_4_ = auVar138._28_4_;
            auVar138 = vminps_avx(auVar81,auVar168);
            auVar139 = vsubps_avx(auVar168,auVar160);
            auVar113 = vsubps_avx(auVar168,auVar138);
            auVar125._8_8_ = uStack_2738;
            auVar125._0_8_ = local_2740;
            auVar88._16_8_ = uStack_2730;
            auVar88._0_16_ = auVar125;
            auVar88._24_8_ = uStack_2728;
            auVar179 = ZEXT3264(auVar88);
            local_29e0 = vblendvps_avx(auVar160,auVar139,auVar88);
            local_29c0 = vblendvps_avx(auVar138,auVar113,auVar88);
            pRVar20 = context->user;
            local_2a40[0] = (RTCHitN)auVar115[0];
            local_2a40[1] = (RTCHitN)auVar115[1];
            local_2a40[2] = (RTCHitN)auVar115[2];
            local_2a40[3] = (RTCHitN)auVar115[3];
            local_2a40[4] = (RTCHitN)auVar115[4];
            local_2a40[5] = (RTCHitN)auVar115[5];
            local_2a40[6] = (RTCHitN)auVar115[6];
            local_2a40[7] = (RTCHitN)auVar115[7];
            local_2a40[8] = (RTCHitN)auVar115[8];
            local_2a40[9] = (RTCHitN)auVar115[9];
            local_2a40[10] = (RTCHitN)auVar115[10];
            local_2a40[0xb] = (RTCHitN)auVar115[0xb];
            local_2a40[0xc] = (RTCHitN)auVar115[0xc];
            local_2a40[0xd] = (RTCHitN)auVar115[0xd];
            local_2a40[0xe] = (RTCHitN)auVar115[0xe];
            local_2a40[0xf] = (RTCHitN)auVar115[0xf];
            local_2a40[0x10] = (RTCHitN)auVar115[0x10];
            local_2a40[0x11] = (RTCHitN)auVar115[0x11];
            local_2a40[0x12] = (RTCHitN)auVar115[0x12];
            local_2a40[0x13] = (RTCHitN)auVar115[0x13];
            local_2a40[0x14] = (RTCHitN)auVar115[0x14];
            local_2a40[0x15] = (RTCHitN)auVar115[0x15];
            local_2a40[0x16] = (RTCHitN)auVar115[0x16];
            local_2a40[0x17] = (RTCHitN)auVar115[0x17];
            local_2a40[0x18] = (RTCHitN)auVar115[0x18];
            local_2a40[0x19] = (RTCHitN)auVar115[0x19];
            local_2a40[0x1a] = (RTCHitN)auVar115[0x1a];
            local_2a40[0x1b] = (RTCHitN)auVar115[0x1b];
            local_2a40[0x1c] = (RTCHitN)auVar115[0x1c];
            local_2a40[0x1d] = (RTCHitN)auVar115[0x1d];
            local_2a40[0x1e] = (RTCHitN)auVar115[0x1e];
            local_2a40[0x1f] = (RTCHitN)auVar115[0x1f];
            local_2a20 = auVar164;
            local_2a00 = auVar161;
            local_29a0 = uVar101;
            uStack_299c = uVar101;
            uStack_2998 = uVar101;
            uStack_2994 = uVar101;
            uStack_2990 = uVar101;
            uStack_298c = uVar101;
            uStack_2988 = uVar101;
            uStack_2984 = uVar101;
            local_2980 = uVar18;
            uStack_297c = uVar18;
            uStack_2978 = uVar18;
            uStack_2974 = uVar18;
            uStack_2970 = uVar18;
            uStack_296c = uVar18;
            uStack_2968 = uVar18;
            uStack_2964 = uVar18;
            auVar160 = vpcmpeqd_avx2(local_29e0,local_29e0);
            local_2d18[1] = auVar160;
            *local_2d18 = auVar160;
            local_2960 = pRVar20->instID[0];
            uStack_295c = local_2960;
            uStack_2958 = local_2960;
            uStack_2954 = local_2960;
            uStack_2950 = local_2960;
            uStack_294c = local_2960;
            uStack_2948 = local_2960;
            uStack_2944 = local_2960;
            local_2940 = pRVar20->instPrimID[0];
            uStack_293c = local_2940;
            uStack_2938 = local_2940;
            uStack_2934 = local_2940;
            uStack_2930 = local_2940;
            uStack_292c = local_2940;
            uStack_2928 = local_2940;
            uStack_2924 = local_2940;
            auVar138 = vblendvps_avx(local_2cc0,auVar129,auVar144);
            ((Geometry *)((long)ray + 0xc0))->intersectionFilterN =
                 (RTCFilterFunctionN)auVar138._0_8_;
            ((Geometry *)((long)ray + 0xc0))->occlusionFilterN = (RTCFilterFunctionN)auVar138._8_8_;
            ((Geometry *)((long)ray + 0xc0))->pointQueryFunc =
                 (RTCPointQueryFunction)auVar138._16_8_;
            *(long *)&((Geometry *)((long)ray + 0xc0))->field_0x58 = auVar138._24_8_;
            local_2d10.valid = (int *)local_2ca0;
            local_2d10.geometryUserPtr = unaff_R15->userPtr;
            local_2d10.context = context->user;
            local_2d10.hit = local_2a40;
            local_2d10.N = 8;
            local_2d10.ray = (RTCRayN *)ray;
            local_2ca0 = auVar144;
            auVar138 = local_2cc0;
            if (unaff_R15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              _auStack_2d98 = auVar90._8_24_;
              local_2da0 = auVar97;
              auVar144 = ZEXT1632(auVar160._0_16_);
              auVar165 = ZEXT1664(auVar164._0_16_);
              auVar174 = ZEXT1664(local_2d60._0_16_);
              auVar179 = ZEXT1664(auVar125);
              local_2da8 = (Geometry *)ray;
              (*unaff_R15->occlusionFilterN)(&local_2d10);
              auVar160 = vpcmpeqd_avx2(auVar144,auVar144);
              auVar190 = ZEXT3264(CONCAT428(0x3f800003,
                                            CONCAT424(0x3f800003,
                                                      CONCAT420(0x3f800003,
                                                                CONCAT416(0x3f800003,
                                                                          CONCAT412(0x3f800003,
                                                                                    CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
              auVar185 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar97 = local_2da0;
              ray = (RayK<8> *)local_2da8;
              auVar92 = local_2cc0;
              auVar138 = local_2cc0;
            }
            local_2cc0 = auVar92;
            auVar144 = vpcmpeqd_avx2(ZEXT1632(ZEXT816(0) << 0x40),local_2ca0);
            auVar161 = auVar160 & ~auVar144;
            if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar161 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar161 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar161 >> 0x7f,0) == '\0') &&
                  (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar161 >> 0xbf,0) == '\0') &&
                (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar161[0x1f]) {
              auVar144 = auVar144 ^ auVar160;
            }
            else {
              p_Var21 = context->args->filter;
              if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((unaff_R15->field_8).field_0x2 & 0x40) != 0)))
                 ) {
                local_2da0 = auVar97;
                auVar144 = ZEXT1632(auVar160._0_16_);
                auVar165 = ZEXT1664(auVar165._0_16_);
                auVar174 = ZEXT1664(auVar174._0_16_);
                auVar179 = ZEXT1664(auVar179._0_16_);
                local_2cc0 = auVar138;
                (*p_Var21)(&local_2d10);
                auVar160 = vpcmpeqd_avx2(auVar144,auVar144);
                auVar190 = ZEXT3264(CONCAT428(0x3f800003,
                                              CONCAT424(0x3f800003,
                                                        CONCAT420(0x3f800003,
                                                                  CONCAT416(0x3f800003,
                                                                            CONCAT412(0x3f800003,
                                                                                      CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                auVar185 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar97 = local_2da0;
                unaff_R15 = (Geometry *)ray;
                auVar138 = local_2cc0;
              }
              auVar161 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),local_2ca0);
              auVar144 = auVar161 ^ auVar160;
              auVar131._8_4_ = 0xff800000;
              auVar131._0_8_ = 0xff800000ff800000;
              auVar131._12_4_ = 0xff800000;
              auVar131._16_4_ = 0xff800000;
              auVar131._20_4_ = 0xff800000;
              auVar131._24_4_ = 0xff800000;
              auVar131._28_4_ = 0xff800000;
              auVar16._0_8_ = *(undefined8 *)(local_2d10.ray + 0x100);
              auVar16._8_8_ = *(undefined8 *)(local_2d10.ray + 0x108);
              auVar16._16_8_ = *(undefined8 *)(local_2d10.ray + 0x110);
              auVar16._24_8_ = *(undefined8 *)(local_2d10.ray + 0x118);
              auVar160 = vblendvps_avx(auVar131,auVar16,auVar161);
              *(long *)(local_2d10.ray + 0x100) = auVar160._0_8_;
              *(long *)(local_2d10.ray + 0x108) = auVar160._8_8_;
              *(long *)(local_2d10.ray + 0x110) = auVar160._16_8_;
              *(long *)(local_2d10.ray + 0x118) = auVar160._24_8_;
            }
            auVar138 = vblendvps_avx(auVar138,*(undefined1 (*) [32])local_2d68,auVar144);
            *(undefined1 (*) [32])local_2d68 = auVar138;
            auVar92 = local_2cc0;
          }
          local_2cc0 = auVar92;
          auVar144 = vandnps_avx(auVar144,local_2d40);
          auVar92 = local_2cc0;
        }
      }
      local_2cc0 = auVar92;
      if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar144 >> 0x7f,0) == '\0') &&
            (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar144 >> 0xbf,0) == '\0') &&
          (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar144[0x1f]) {
        bVar102 = false;
      }
      else {
        auVar9._0_8_ = (((Geometry *)ray)->super_RefCount)._vptr_RefCount;
        auVar9._8_8_ = (((Geometry *)ray)->super_RefCount).refCounter;
        auVar9._16_8_ = ((Geometry *)ray)->device;
        auVar9._24_8_ = ((Geometry *)ray)->userPtr;
        auVar10._0_4_ = ((Geometry *)ray)->numPrimitives;
        auVar10._4_4_ = ((Geometry *)ray)->numTimeSteps;
        auVar10._8_4_ = ((Geometry *)ray)->fnumTimeSegments;
        auVar10._12_4_ = (((Geometry *)ray)->time_range).lower;
        auVar10._16_4_ = (((Geometry *)ray)->time_range).upper;
        auVar10._20_4_ = ((Geometry *)ray)->mask;
        auVar10._24_4_ = ((Geometry *)ray)->modCounter_;
        auVar10._28_4_ = ((Geometry *)ray)->field_8;
        auVar11._0_8_ = ((Geometry *)ray)->intersectionFilterN;
        auVar11._8_8_ = ((Geometry *)ray)->occlusionFilterN;
        auVar11._16_8_ = ((Geometry *)ray)->pointQueryFunc;
        auVar11._24_8_ = *(undefined8 *)&((Geometry *)ray)->field_0x58;
        local_2a80 = vsubps_avx(local_2ba0,auVar9);
        local_2aa0 = vsubps_avx(local_2bc0,auVar10);
        local_2ac0 = vsubps_avx(local_2be0,auVar11);
        auVar138 = vsubps_avx(local_2640,auVar9);
        auVar160 = vsubps_avx(local_2660,auVar10);
        auVar161 = vsubps_avx(local_2680,auVar11);
        auVar139 = vsubps_avx(local_2b60,auVar9);
        auVar115 = vsubps_avx(_local_2c40,auVar10);
        auVar164 = vsubps_avx(local_2b80,auVar11);
        local_2ae0 = vsubps_avx(auVar139,local_2a80);
        local_2b20 = vsubps_avx(auVar115,local_2aa0);
        local_2b00 = vsubps_avx(auVar164,local_2ac0);
        auVar176._0_4_ = auVar139._0_4_ + local_2a80._0_4_;
        auVar176._4_4_ = auVar139._4_4_ + local_2a80._4_4_;
        auVar176._8_4_ = auVar139._8_4_ + local_2a80._8_4_;
        auVar176._12_4_ = auVar139._12_4_ + local_2a80._12_4_;
        auVar176._16_4_ = auVar139._16_4_ + local_2a80._16_4_;
        auVar176._20_4_ = auVar139._20_4_ + local_2a80._20_4_;
        auVar176._24_4_ = auVar139._24_4_ + local_2a80._24_4_;
        auVar176._28_4_ = auVar139._28_4_ + local_2a80._28_4_;
        auVar182._0_4_ = auVar115._0_4_ + local_2aa0._0_4_;
        auVar182._4_4_ = auVar115._4_4_ + local_2aa0._4_4_;
        auVar182._8_4_ = auVar115._8_4_ + local_2aa0._8_4_;
        auVar182._12_4_ = auVar115._12_4_ + local_2aa0._12_4_;
        auVar182._16_4_ = auVar115._16_4_ + local_2aa0._16_4_;
        auVar182._20_4_ = auVar115._20_4_ + local_2aa0._20_4_;
        auVar182._24_4_ = auVar115._24_4_ + local_2aa0._24_4_;
        fVar103 = local_2aa0._28_4_;
        auVar182._28_4_ = auVar115._28_4_ + fVar103;
        fVar191 = local_2ac0._0_4_;
        auVar188._0_4_ = fVar191 + auVar164._0_4_;
        fVar194 = local_2ac0._4_4_;
        auVar188._4_4_ = fVar194 + auVar164._4_4_;
        fVar195 = local_2ac0._8_4_;
        auVar188._8_4_ = fVar195 + auVar164._8_4_;
        fVar196 = local_2ac0._12_4_;
        auVar188._12_4_ = fVar196 + auVar164._12_4_;
        fVar197 = local_2ac0._16_4_;
        auVar188._16_4_ = fVar197 + auVar164._16_4_;
        fVar198 = local_2ac0._20_4_;
        auVar188._20_4_ = fVar198 + auVar164._20_4_;
        fVar199 = local_2ac0._24_4_;
        auVar188._24_4_ = fVar199 + auVar164._24_4_;
        auVar188._28_4_ = local_2ac0._28_4_ + auVar164._28_4_;
        auVar134._0_4_ = auVar182._0_4_ * local_2b00._0_4_;
        auVar134._4_4_ = auVar182._4_4_ * local_2b00._4_4_;
        auVar134._8_4_ = auVar182._8_4_ * local_2b00._8_4_;
        auVar134._12_4_ = auVar182._12_4_ * local_2b00._12_4_;
        auVar134._16_4_ = auVar182._16_4_ * local_2b00._16_4_;
        auVar134._20_4_ = auVar182._20_4_ * local_2b00._20_4_;
        auVar134._28_36_ = auVar190._28_36_;
        auVar134._24_4_ = auVar182._24_4_ * local_2b00._24_4_;
        auVar31 = vfmsub231ps_fma(auVar134._0_32_,local_2b20,auVar188);
        auVar60._4_4_ = auVar188._4_4_ * local_2ae0._4_4_;
        auVar60._0_4_ = auVar188._0_4_ * local_2ae0._0_4_;
        auVar60._8_4_ = auVar188._8_4_ * local_2ae0._8_4_;
        auVar60._12_4_ = auVar188._12_4_ * local_2ae0._12_4_;
        auVar60._16_4_ = auVar188._16_4_ * local_2ae0._16_4_;
        auVar60._20_4_ = auVar188._20_4_ * local_2ae0._20_4_;
        auVar60._24_4_ = auVar188._24_4_ * local_2ae0._24_4_;
        auVar60._28_4_ = auVar188._28_4_;
        auVar125 = vfmsub231ps_fma(auVar60,local_2b00,auVar176);
        auVar61._4_4_ = auVar176._4_4_ * local_2b20._4_4_;
        auVar61._0_4_ = auVar176._0_4_ * local_2b20._0_4_;
        auVar61._8_4_ = auVar176._8_4_ * local_2b20._8_4_;
        auVar61._12_4_ = auVar176._12_4_ * local_2b20._12_4_;
        auVar61._16_4_ = auVar176._16_4_ * local_2b20._16_4_;
        auVar61._20_4_ = auVar176._20_4_ * local_2b20._20_4_;
        auVar61._24_4_ = auVar176._24_4_ * local_2b20._24_4_;
        auVar61._28_4_ = auVar176._28_4_;
        auVar33 = vfmsub231ps_fma(auVar61,local_2ae0,auVar182);
        pGVar32 = (Geometry *)((long)ray + 0xc0);
        fVar135 = *(float *)&(pGVar32->super_RefCount)._vptr_RefCount;
        fVar145 = *(float *)((long)&(((Geometry *)((long)ray + 0xc0))->super_RefCount).
                                    _vptr_RefCount + 4);
        fVar147 = *(float *)&(((Geometry *)((long)ray + 0xc0))->super_RefCount).refCounter.
                             super___atomic_base<unsigned_long>._M_i;
        fVar149 = *(float *)((long)&(((Geometry *)((long)ray + 0xc0))->super_RefCount).refCounter.
                                    super___atomic_base<unsigned_long>._M_i + 4);
        fVar151 = *(float *)&((Geometry *)((long)ray + 0xc0))->device;
        fVar153 = *(float *)((long)&((Geometry *)((long)ray + 0xc0))->device + 4);
        fVar155 = *(float *)&((Geometry *)((long)ray + 0xc0))->userPtr;
        auVar89 = *(undefined1 (*) [28])pGVar32;
        auVar91._0_8_ = (pGVar32->super_RefCount)._vptr_RefCount;
        auVar91._8_8_ = (pGVar32->super_RefCount).refCounter;
        auVar91._16_8_ = pGVar32->device;
        auVar91._24_8_ = pGVar32->userPtr;
        auVar62._4_4_ = auVar33._4_4_ * fVar145;
        auVar62._0_4_ = auVar33._0_4_ * fVar135;
        auVar62._8_4_ = auVar33._8_4_ * fVar147;
        auVar62._12_4_ = auVar33._12_4_ * fVar149;
        auVar62._16_4_ = fVar151 * 0.0;
        auVar62._20_4_ = fVar153 * 0.0;
        auVar62._24_4_ = fVar155 * 0.0;
        auVar62._28_4_ = local_2b20._28_4_;
        local_2a60._0_8_ = ((Geometry *)((long)ray + 0x60))->intersectionFilterN;
        local_2a60._8_8_ = ((Geometry *)((long)ray + 0x60))->occlusionFilterN;
        local_2a60._16_8_ = ((Geometry *)((long)ray + 0x60))->pointQueryFunc;
        local_2a60._24_8_ = *(undefined8 *)&((Geometry *)((long)ray + 0x60))->field_0x58;
        auVar125 = vfmadd231ps_fma(auVar62,local_2a60,ZEXT1632(auVar125));
        auVar12._0_4_ = ((Geometry *)((long)ray + 0x60))->numPrimitives;
        auVar12._4_4_ = ((Geometry *)((long)ray + 0x60))->numTimeSteps;
        auVar12._8_4_ = ((Geometry *)((long)ray + 0x60))->fnumTimeSegments;
        auVar12._12_4_ = (((Geometry *)((long)ray + 0x60))->time_range).lower;
        auVar12._16_4_ = (((Geometry *)((long)ray + 0x60))->time_range).upper;
        auVar12._20_4_ = ((Geometry *)((long)ray + 0x60))->mask;
        auVar12._24_4_ = ((Geometry *)((long)ray + 0x60))->modCounter_;
        auVar12._28_4_ = ((Geometry *)((long)ray + 0x60))->field_8;
        auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar12,ZEXT1632(auVar31));
        auVar179 = ZEXT1664(auVar125);
        local_2b40 = vsubps_avx(local_2aa0,auVar160);
        local_2b60 = vsubps_avx(local_2ac0,auVar161);
        auVar177._0_4_ = local_2aa0._0_4_ + auVar160._0_4_;
        auVar177._4_4_ = local_2aa0._4_4_ + auVar160._4_4_;
        auVar177._8_4_ = local_2aa0._8_4_ + auVar160._8_4_;
        auVar177._12_4_ = local_2aa0._12_4_ + auVar160._12_4_;
        auVar177._16_4_ = local_2aa0._16_4_ + auVar160._16_4_;
        auVar177._20_4_ = local_2aa0._20_4_ + auVar160._20_4_;
        auVar177._24_4_ = local_2aa0._24_4_ + auVar160._24_4_;
        auVar177._28_4_ = fVar103 + auVar160._28_4_;
        auVar141._0_4_ = fVar191 + auVar161._0_4_;
        auVar141._4_4_ = fVar194 + auVar161._4_4_;
        auVar141._8_4_ = fVar195 + auVar161._8_4_;
        auVar141._12_4_ = fVar196 + auVar161._12_4_;
        auVar141._16_4_ = fVar197 + auVar161._16_4_;
        auVar141._20_4_ = fVar198 + auVar161._20_4_;
        auVar141._24_4_ = fVar199 + auVar161._24_4_;
        auVar141._28_4_ = local_2ac0._28_4_ + auVar161._28_4_;
        fVar120 = local_2b60._0_4_;
        fVar124 = local_2b60._4_4_;
        auVar63._4_4_ = auVar177._4_4_ * fVar124;
        auVar63._0_4_ = auVar177._0_4_ * fVar120;
        fVar24 = local_2b60._8_4_;
        auVar63._8_4_ = auVar177._8_4_ * fVar24;
        fVar121 = local_2b60._12_4_;
        auVar63._12_4_ = auVar177._12_4_ * fVar121;
        fVar26 = local_2b60._16_4_;
        auVar63._16_4_ = auVar177._16_4_ * fVar26;
        fVar148 = local_2b60._20_4_;
        auVar63._20_4_ = auVar177._20_4_ * fVar148;
        fVar154 = local_2b60._24_4_;
        auVar63._24_4_ = auVar177._24_4_ * fVar154;
        auVar63._28_4_ = fVar103;
        auVar33 = vfmsub231ps_fma(auVar63,local_2b40,auVar141);
        local_2b80 = vsubps_avx(local_2a80,auVar138);
        fVar103 = local_2b80._0_4_;
        fVar22 = local_2b80._4_4_;
        auVar64._4_4_ = auVar141._4_4_ * fVar22;
        auVar64._0_4_ = auVar141._0_4_ * fVar103;
        fVar146 = local_2b80._8_4_;
        auVar64._8_4_ = auVar141._8_4_ * fVar146;
        fVar123 = local_2b80._12_4_;
        auVar64._12_4_ = auVar141._12_4_ * fVar123;
        fVar27 = local_2b80._16_4_;
        auVar64._16_4_ = auVar141._16_4_ * fVar27;
        fVar150 = local_2b80._20_4_;
        auVar64._20_4_ = auVar141._20_4_ * fVar150;
        fVar29 = local_2b80._24_4_;
        auVar64._24_4_ = auVar141._24_4_ * fVar29;
        auVar64._28_4_ = auVar141._28_4_;
        auVar172._0_4_ = auVar138._0_4_ + local_2a80._0_4_;
        auVar172._4_4_ = auVar138._4_4_ + local_2a80._4_4_;
        auVar172._8_4_ = auVar138._8_4_ + local_2a80._8_4_;
        auVar172._12_4_ = auVar138._12_4_ + local_2a80._12_4_;
        auVar172._16_4_ = auVar138._16_4_ + local_2a80._16_4_;
        auVar172._20_4_ = auVar138._20_4_ + local_2a80._20_4_;
        auVar172._24_4_ = auVar138._24_4_ + local_2a80._24_4_;
        auVar172._28_4_ = auVar138._28_4_ + local_2a80._28_4_;
        auVar31 = vfmsub231ps_fma(auVar64,local_2b60,auVar172);
        fVar122 = local_2b40._0_4_;
        fVar23 = local_2b40._4_4_;
        auVar65._4_4_ = auVar172._4_4_ * fVar23;
        auVar65._0_4_ = auVar172._0_4_ * fVar122;
        fVar119 = local_2b40._8_4_;
        auVar65._8_4_ = auVar172._8_4_ * fVar119;
        fVar25 = local_2b40._12_4_;
        auVar65._12_4_ = auVar172._12_4_ * fVar25;
        fVar28 = local_2b40._16_4_;
        auVar65._16_4_ = auVar172._16_4_ * fVar28;
        fVar152 = local_2b40._20_4_;
        auVar65._20_4_ = auVar172._20_4_ * fVar152;
        fVar30 = local_2b40._24_4_;
        auVar65._24_4_ = auVar172._24_4_ * fVar30;
        auVar65._28_4_ = auVar172._28_4_;
        auVar34 = vfmsub231ps_fma(auVar65,local_2b80,auVar177);
        auVar173._0_4_ = fVar135 * auVar34._0_4_;
        auVar173._4_4_ = fVar145 * auVar34._4_4_;
        auVar173._8_4_ = fVar147 * auVar34._8_4_;
        auVar173._12_4_ = fVar149 * auVar34._12_4_;
        auVar173._16_4_ = fVar151 * 0.0;
        auVar173._20_4_ = fVar153 * 0.0;
        auVar173._24_4_ = fVar155 * 0.0;
        auVar173._28_4_ = 0;
        auVar31 = vfmadd231ps_fma(auVar173,local_2a60,ZEXT1632(auVar31));
        auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),auVar12,ZEXT1632(auVar33));
        auVar174 = ZEXT1664(auVar31);
        auVar129 = vsubps_avx(auVar138,auVar139);
        auVar142._0_4_ = auVar138._0_4_ + auVar139._0_4_;
        auVar142._4_4_ = auVar138._4_4_ + auVar139._4_4_;
        auVar142._8_4_ = auVar138._8_4_ + auVar139._8_4_;
        auVar142._12_4_ = auVar138._12_4_ + auVar139._12_4_;
        auVar142._16_4_ = auVar138._16_4_ + auVar139._16_4_;
        auVar142._20_4_ = auVar138._20_4_ + auVar139._20_4_;
        auVar142._24_4_ = auVar138._24_4_ + auVar139._24_4_;
        auVar142._28_4_ = auVar138._28_4_ + auVar139._28_4_;
        auVar165 = ZEXT3264(local_2c60);
        auVar139 = vsubps_avx(auVar160,auVar115);
        auVar128._0_4_ = auVar160._0_4_ + auVar115._0_4_;
        auVar128._4_4_ = auVar160._4_4_ + auVar115._4_4_;
        auVar128._8_4_ = auVar160._8_4_ + auVar115._8_4_;
        auVar128._12_4_ = auVar160._12_4_ + auVar115._12_4_;
        auVar128._16_4_ = auVar160._16_4_ + auVar115._16_4_;
        auVar128._20_4_ = auVar160._20_4_ + auVar115._20_4_;
        auVar128._24_4_ = auVar160._24_4_ + auVar115._24_4_;
        auVar128._28_4_ = auVar160._28_4_ + auVar115._28_4_;
        auVar113 = vsubps_avx(auVar161,auVar164);
        auVar114._0_4_ = auVar161._0_4_ + auVar164._0_4_;
        auVar114._4_4_ = auVar161._4_4_ + auVar164._4_4_;
        auVar114._8_4_ = auVar161._8_4_ + auVar164._8_4_;
        auVar114._12_4_ = auVar161._12_4_ + auVar164._12_4_;
        auVar114._16_4_ = auVar161._16_4_ + auVar164._16_4_;
        auVar114._20_4_ = auVar161._20_4_ + auVar164._20_4_;
        auVar114._24_4_ = auVar161._24_4_ + auVar164._24_4_;
        auVar114._28_4_ = auVar161._28_4_ + auVar164._28_4_;
        auVar66._4_4_ = auVar113._4_4_ * auVar128._4_4_;
        auVar66._0_4_ = auVar113._0_4_ * auVar128._0_4_;
        auVar66._8_4_ = auVar113._8_4_ * auVar128._8_4_;
        auVar66._12_4_ = auVar113._12_4_ * auVar128._12_4_;
        auVar66._16_4_ = auVar113._16_4_ * auVar128._16_4_;
        auVar66._20_4_ = auVar113._20_4_ * auVar128._20_4_;
        auVar66._24_4_ = auVar113._24_4_ * auVar128._24_4_;
        auVar66._28_4_ = local_2b40._28_4_;
        auVar34 = vfmsub231ps_fma(auVar66,auVar139,auVar114);
        auVar67._4_4_ = auVar129._4_4_ * auVar114._4_4_;
        auVar67._0_4_ = auVar129._0_4_ * auVar114._0_4_;
        auVar67._8_4_ = auVar129._8_4_ * auVar114._8_4_;
        auVar67._12_4_ = auVar129._12_4_ * auVar114._12_4_;
        auVar67._16_4_ = auVar129._16_4_ * auVar114._16_4_;
        auVar67._20_4_ = auVar129._20_4_ * auVar114._20_4_;
        auVar67._24_4_ = auVar129._24_4_ * auVar114._24_4_;
        auVar67._28_4_ = auVar114._28_4_;
        auVar33 = vfmsub231ps_fma(auVar67,auVar113,auVar142);
        auVar68._4_4_ = auVar142._4_4_ * auVar139._4_4_;
        auVar68._0_4_ = auVar142._0_4_ * auVar139._0_4_;
        auVar68._8_4_ = auVar142._8_4_ * auVar139._8_4_;
        auVar68._12_4_ = auVar142._12_4_ * auVar139._12_4_;
        auVar68._16_4_ = auVar142._16_4_ * auVar139._16_4_;
        auVar68._20_4_ = auVar142._20_4_ * auVar139._20_4_;
        auVar68._24_4_ = auVar142._24_4_ * auVar139._24_4_;
        auVar68._28_4_ = auVar142._28_4_;
        auVar35 = vfmsub231ps_fma(auVar68,auVar129,auVar128);
        auVar69._4_4_ = fVar145 * auVar35._4_4_;
        auVar69._0_4_ = fVar135 * auVar35._0_4_;
        auVar69._8_4_ = fVar147 * auVar35._8_4_;
        auVar69._12_4_ = fVar149 * auVar35._12_4_;
        auVar69._16_4_ = fVar151 * 0.0;
        auVar69._20_4_ = fVar153 * 0.0;
        auVar69._24_4_ = fVar155 * 0.0;
        auVar69._28_4_ = auVar128._28_4_;
        auVar33 = vfmadd231ps_fma(auVar69,local_2a60,ZEXT1632(auVar33));
        auVar33 = vfmadd231ps_fma(ZEXT1632(auVar33),auVar12,ZEXT1632(auVar34));
        local_2ba0 = ZEXT1632(CONCAT412(auVar33._12_4_ + auVar125._12_4_ + auVar31._12_4_,
                                        CONCAT48(auVar33._8_4_ + auVar125._8_4_ + auVar31._8_4_,
                                                 CONCAT44(auVar33._4_4_ +
                                                          auVar125._4_4_ + auVar31._4_4_,
                                                          auVar33._0_4_ +
                                                          auVar125._0_4_ + auVar31._0_4_))));
        local_2cc0 = ZEXT1632(auVar125);
        auVar138 = vminps_avx(local_2cc0,ZEXT1632(auVar31));
        auVar138 = vminps_avx(auVar138,ZEXT1632(auVar33));
        local_2bc0 = vandps_avx(local_2ba0,local_2c60);
        fVar135 = local_2bc0._0_4_ * 1.1920929e-07;
        fVar145 = local_2bc0._4_4_ * 1.1920929e-07;
        auVar70._4_4_ = fVar145;
        auVar70._0_4_ = fVar135;
        fVar147 = local_2bc0._8_4_ * 1.1920929e-07;
        auVar70._8_4_ = fVar147;
        fVar149 = local_2bc0._12_4_ * 1.1920929e-07;
        auVar70._12_4_ = fVar149;
        fVar151 = local_2bc0._16_4_ * 1.1920929e-07;
        auVar70._16_4_ = fVar151;
        fVar153 = local_2bc0._20_4_ * 1.1920929e-07;
        auVar70._20_4_ = fVar153;
        fVar155 = local_2bc0._24_4_ * 1.1920929e-07;
        auVar70._24_4_ = fVar155;
        auVar70._28_4_ = 0x34000000;
        auVar158._0_4_ = (uint)fVar135 ^ local_2d60._0_4_;
        auVar158._4_4_ = (uint)fVar145 ^ local_2d60._4_4_;
        auVar158._8_4_ = (uint)fVar147 ^ local_2d60._8_4_;
        auVar158._12_4_ = (uint)fVar149 ^ local_2d60._12_4_;
        auVar158._16_4_ = (uint)fVar151 ^ local_2d60._16_4_;
        auVar158._20_4_ = (uint)fVar153 ^ local_2d60._20_4_;
        auVar158._24_4_ = (uint)fVar155 ^ local_2d60._24_4_;
        auVar158._28_4_ = local_2d60._28_4_ ^ 0x34000000;
        auVar138 = vcmpps_avx(auVar138,auVar158,5);
        auVar161 = vmaxps_avx(local_2cc0,ZEXT1632(auVar31));
        auVar160 = vmaxps_avx(auVar161,ZEXT1632(auVar33));
        auVar160 = vcmpps_avx(auVar160,auVar70,2);
        _local_2da0 = vorps_avx(auVar138,auVar160);
        auVar138 = auVar144 & _local_2da0;
        local_2d40 = auVar144;
        _local_2c40 = auVar91;
        if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar138 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar138 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar138 >> 0x7f,0) == '\0') &&
              (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar138 >> 0xbf,0) == '\0') &&
            (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar138[0x1f]) {
LAB_005b731c:
          _local_2da0 = auVar115;
          auVar185 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar190 = ZEXT3264(CONCAT428(0x3f800003,
                                        CONCAT424(0x3f800003,
                                                  CONCAT420(0x3f800003,
                                                            CONCAT416(0x3f800003,
                                                                      CONCAT412(0x3f800003,
                                                                                CONCAT48(0x3f800003,
                                                                                                                                                                                  
                                                  0x3f8000033f800003)))))));
        }
        else {
          local_2be0 = ZEXT1632(auVar31);
          auVar71._4_4_ = fVar23 * local_2b00._4_4_;
          auVar71._0_4_ = fVar122 * local_2b00._0_4_;
          auVar71._8_4_ = fVar119 * local_2b00._8_4_;
          auVar71._12_4_ = fVar25 * local_2b00._12_4_;
          auVar71._16_4_ = fVar28 * local_2b00._16_4_;
          auVar71._20_4_ = fVar152 * local_2b00._20_4_;
          auVar71._24_4_ = fVar30 * local_2b00._24_4_;
          auVar71._28_4_ = local_2da0._28_4_;
          auVar72._4_4_ = fVar22 * local_2b20._4_4_;
          auVar72._0_4_ = fVar103 * local_2b20._0_4_;
          auVar72._8_4_ = fVar146 * local_2b20._8_4_;
          auVar72._12_4_ = fVar123 * local_2b20._12_4_;
          auVar72._16_4_ = fVar27 * local_2b20._16_4_;
          auVar72._20_4_ = fVar150 * local_2b20._20_4_;
          auVar72._24_4_ = fVar29 * local_2b20._24_4_;
          auVar72._28_4_ = auVar160._28_4_;
          auVar33 = vfmsub213ps_fma(local_2b20,local_2b60,auVar71);
          auVar73._4_4_ = fVar124 * auVar139._4_4_;
          auVar73._0_4_ = fVar120 * auVar139._0_4_;
          auVar73._8_4_ = fVar24 * auVar139._8_4_;
          auVar73._12_4_ = fVar121 * auVar139._12_4_;
          auVar73._16_4_ = fVar26 * auVar139._16_4_;
          auVar73._20_4_ = fVar148 * auVar139._20_4_;
          auVar73._24_4_ = fVar154 * auVar139._24_4_;
          auVar73._28_4_ = 0x34000000;
          auVar74._4_4_ = fVar22 * auVar113._4_4_;
          auVar74._0_4_ = fVar103 * auVar113._0_4_;
          auVar74._8_4_ = fVar146 * auVar113._8_4_;
          auVar74._12_4_ = fVar123 * auVar113._12_4_;
          auVar74._16_4_ = fVar27 * auVar113._16_4_;
          auVar74._20_4_ = fVar150 * auVar113._20_4_;
          auVar74._24_4_ = fVar29 * auVar113._24_4_;
          auVar74._28_4_ = auVar161._28_4_;
          auVar34 = vfmsub213ps_fma(auVar113,local_2b40,auVar73);
          auVar138 = vandps_avx(auVar71,local_2c60);
          auVar160 = vandps_avx(auVar73,local_2c60);
          auVar138 = vcmpps_avx(auVar138,auVar160,1);
          auVar161 = vblendvps_avx(ZEXT1632(auVar34),ZEXT1632(auVar33),auVar138);
          auVar179 = ZEXT3264(auVar161);
          auVar75._4_4_ = auVar129._4_4_ * fVar23;
          auVar75._0_4_ = auVar129._0_4_ * fVar122;
          auVar75._8_4_ = auVar129._8_4_ * fVar119;
          auVar75._12_4_ = auVar129._12_4_ * fVar25;
          auVar75._16_4_ = auVar129._16_4_ * fVar28;
          auVar75._20_4_ = auVar129._20_4_ * fVar152;
          auVar75._24_4_ = auVar129._24_4_ * fVar30;
          auVar75._28_4_ = auVar138._28_4_;
          auVar33 = vfmsub213ps_fma(auVar129,local_2b60,auVar74);
          auVar76._4_4_ = fVar124 * local_2ae0._4_4_;
          auVar76._0_4_ = fVar120 * local_2ae0._0_4_;
          auVar76._8_4_ = fVar24 * local_2ae0._8_4_;
          auVar76._12_4_ = fVar121 * local_2ae0._12_4_;
          auVar76._16_4_ = fVar26 * local_2ae0._16_4_;
          auVar76._20_4_ = fVar148 * local_2ae0._20_4_;
          auVar76._24_4_ = fVar154 * local_2ae0._24_4_;
          auVar76._28_4_ = auVar160._28_4_;
          auVar34 = vfmsub213ps_fma(local_2b00,local_2b80,auVar76);
          auVar138 = vandps_avx(auVar76,local_2c60);
          auVar160 = vandps_avx(auVar74,local_2c60);
          auVar138 = vcmpps_avx(auVar138,auVar160,1);
          auVar164 = vblendvps_avx(ZEXT1632(auVar33),ZEXT1632(auVar34),auVar138);
          auVar174 = ZEXT3264(auVar164);
          auVar33 = vfmsub213ps_fma(local_2ae0,local_2b40,auVar72);
          auVar34 = vfmsub213ps_fma(auVar139,local_2b80,auVar75);
          auVar138 = vandps_avx(auVar72,local_2c60);
          auVar160 = vandps_avx(auVar75,local_2c60);
          auVar160 = vcmpps_avx(auVar138,auVar160,1);
          auVar139 = vblendvps_avx(ZEXT1632(auVar34),ZEXT1632(auVar33),auVar160);
          auVar165 = ZEXT3264(auVar139);
          local_2c40._0_4_ = auVar89._0_4_;
          local_2c40._4_4_ = auVar89._4_4_;
          fStack_2c38 = auVar89._8_4_;
          fStack_2c34 = auVar89._12_4_;
          fStack_2c30 = auVar89._16_4_;
          fStack_2c2c = auVar89._20_4_;
          fStack_2c28 = auVar89._24_4_;
          auVar77._4_4_ = auVar139._4_4_ * (float)local_2c40._4_4_;
          auVar77._0_4_ = auVar139._0_4_ * (float)local_2c40._0_4_;
          auVar77._8_4_ = auVar139._8_4_ * fStack_2c38;
          auVar77._12_4_ = auVar139._12_4_ * fStack_2c34;
          auVar77._16_4_ = auVar139._16_4_ * fStack_2c30;
          auVar77._20_4_ = auVar139._20_4_ * fStack_2c2c;
          auVar77._24_4_ = auVar139._24_4_ * fStack_2c28;
          auVar77._28_4_ = auVar160._28_4_;
          auVar33 = vfmadd213ps_fma(local_2a60,auVar164,auVar77);
          auVar33 = vfmadd213ps_fma(auVar12,auVar161,ZEXT1632(auVar33));
          fVar103 = auVar33._0_4_ + auVar33._0_4_;
          fVar120 = auVar33._4_4_ + auVar33._4_4_;
          fVar122 = auVar33._8_4_ + auVar33._8_4_;
          fVar124 = auVar33._12_4_ + auVar33._12_4_;
          auVar115 = ZEXT1632(CONCAT412(fVar124,CONCAT48(fVar122,CONCAT44(fVar120,fVar103))));
          auVar78._4_4_ = auVar139._4_4_ * fVar194;
          auVar78._0_4_ = auVar139._0_4_ * fVar191;
          auVar78._8_4_ = auVar139._8_4_ * fVar195;
          auVar78._12_4_ = auVar139._12_4_ * fVar196;
          auVar78._16_4_ = auVar139._16_4_ * fVar197;
          auVar78._20_4_ = auVar139._20_4_ * fVar198;
          auVar78._24_4_ = auVar139._24_4_ * fVar199;
          auVar78._28_4_ = auVar138._28_4_;
          auVar33 = vfmadd213ps_fma(local_2aa0,auVar164,auVar78);
          auVar34 = vfmadd213ps_fma(local_2a80,auVar161,ZEXT1632(auVar33));
          auVar138 = vrcpps_avx(auVar115);
          auVar163._8_4_ = 0x3f800000;
          auVar163._0_8_ = &DAT_3f8000003f800000;
          auVar163._12_4_ = 0x3f800000;
          auVar163._16_4_ = 0x3f800000;
          auVar163._20_4_ = 0x3f800000;
          auVar163._24_4_ = 0x3f800000;
          auVar163._28_4_ = 0x3f800000;
          auVar33 = vfnmadd213ps_fma(auVar138,auVar115,auVar163);
          auVar33 = vfmadd132ps_fma(ZEXT1632(auVar33),auVar138,auVar138);
          auVar79._28_4_ = auVar138._28_4_;
          auVar79._0_28_ =
               ZEXT1628(CONCAT412((auVar34._12_4_ + auVar34._12_4_) * auVar33._12_4_,
                                  CONCAT48((auVar34._8_4_ + auVar34._8_4_) * auVar33._8_4_,
                                           CONCAT44((auVar34._4_4_ + auVar34._4_4_) * auVar33._4_4_,
                                                    (auVar34._0_4_ + auVar34._0_4_) * auVar33._0_4_)
                                          )));
          auVar13._0_8_ = (((Geometry *)((long)ray + 0x60))->super_RefCount)._vptr_RefCount;
          auVar13._8_8_ = (((Geometry *)((long)ray + 0x60))->super_RefCount).refCounter;
          auVar13._16_8_ = ((Geometry *)((long)ray + 0x60))->device;
          auVar13._24_8_ = ((Geometry *)((long)ray + 0x60))->userPtr;
          auVar14._0_8_ = ((Geometry *)((long)ray + 0xc0))->intersectionFilterN;
          auVar14._8_8_ = ((Geometry *)((long)ray + 0xc0))->occlusionFilterN;
          auVar14._16_8_ = ((Geometry *)((long)ray + 0xc0))->pointQueryFunc;
          auVar14._24_8_ = *(undefined8 *)&((Geometry *)((long)ray + 0xc0))->field_0x58;
          auVar138 = vcmpps_avx(auVar13,auVar79,2);
          auVar160 = vcmpps_avx(auVar79,auVar14,2);
          auVar138 = vandps_avx(auVar138,auVar160);
          auVar159._0_4_ = (uint)fVar103 ^ local_2d60._0_4_;
          auVar159._4_4_ = (uint)fVar120 ^ local_2d60._4_4_;
          auVar159._8_4_ = (uint)fVar122 ^ local_2d60._8_4_;
          auVar159._12_4_ = (uint)fVar124 ^ local_2d60._12_4_;
          auVar159._16_4_ = local_2d60._16_4_;
          auVar159._20_4_ = local_2d60._20_4_;
          auVar159._24_4_ = local_2d60._24_4_;
          auVar159._28_4_ = local_2d60._28_4_;
          auVar160 = vcmpps_avx(auVar115,auVar159,4);
          auVar138 = vandps_avx(auVar160,auVar138);
          auVar160 = vandps_avx(auVar144,_local_2da0);
          auVar138 = vpslld_avx2(auVar138,0x1f);
          auVar129 = vpsrad_avx2(auVar138,0x1f);
          auVar138 = auVar160 & auVar129;
          auVar115 = _local_2da0;
          if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar138 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar138 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar138 >> 0x7f,0) == '\0') &&
                (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar138 >> 0xbf,0) == '\0') &&
              (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar138[0x1f]) goto LAB_005b731c;
          auVar138 = vandps_avx(auVar129,auVar160);
          uVar3 = *(uint *)(lVar95 + uVar100 * 4);
          unaff_R15 = (context->scene->geometries).items[uVar3].ptr;
          uVar18 = unaff_R15->mask;
          auVar130._4_4_ = uVar18;
          auVar130._0_4_ = uVar18;
          auVar130._8_4_ = uVar18;
          auVar130._12_4_ = uVar18;
          auVar130._16_4_ = uVar18;
          auVar130._20_4_ = uVar18;
          auVar130._24_4_ = uVar18;
          auVar130._28_4_ = uVar18;
          auVar15._0_8_ = (((Geometry *)((long)ray + 0x120))->super_RefCount)._vptr_RefCount;
          auVar15._8_8_ = (((Geometry *)((long)ray + 0x120))->super_RefCount).refCounter;
          auVar15._16_8_ = ((Geometry *)((long)ray + 0x120))->device;
          auVar15._24_8_ = ((Geometry *)((long)ray + 0x120))->userPtr;
          auVar160 = vpand_avx2(auVar130,auVar15);
          auVar115 = vpcmpeqd_avx2(auVar160,_DAT_02020f00);
          auVar160 = auVar138 & ~auVar115;
          auVar185 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar190 = ZEXT3264(CONCAT428(0x3f800003,
                                        CONCAT424(0x3f800003,
                                                  CONCAT420(0x3f800003,
                                                            CONCAT416(0x3f800003,
                                                                      CONCAT412(0x3f800003,
                                                                                CONCAT48(0x3f800003,
                                                                                                                                                                                  
                                                  0x3f8000033f800003)))))));
          if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar160 >> 0x7f,0) != '\0') ||
                (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar160 >> 0xbf,0) != '\0') ||
              (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar160[0x1f] < '\0') {
            uVar101 = *(undefined4 *)((long)&local_2bf0 + uVar100 * 4);
            auVar144 = vandnps_avx(auVar115,auVar138);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (unaff_R15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar138 = vrcpps_avx(local_2ba0);
              auVar169._8_4_ = 0x3f800000;
              auVar169._0_8_ = &DAT_3f8000003f800000;
              auVar169._12_4_ = 0x3f800000;
              auVar169._16_4_ = 0x3f800000;
              auVar169._20_4_ = 0x3f800000;
              auVar169._24_4_ = 0x3f800000;
              auVar169._28_4_ = 0x3f800000;
              auVar33 = vfnmadd213ps_fma(local_2ba0,auVar138,auVar169);
              auVar33 = vfmadd132ps_fma(ZEXT1632(auVar33),auVar138,auVar138);
              auVar117._8_4_ = 0x219392ef;
              auVar117._0_8_ = 0x219392ef219392ef;
              auVar117._12_4_ = 0x219392ef;
              auVar117._16_4_ = 0x219392ef;
              auVar117._20_4_ = 0x219392ef;
              auVar117._24_4_ = 0x219392ef;
              auVar117._28_4_ = 0x219392ef;
              auVar138 = vcmpps_avx(local_2bc0,auVar117,5);
              auVar138 = vandps_avx(auVar138,ZEXT1632(auVar33));
              auVar82._4_4_ = auVar138._4_4_ * auVar125._4_4_;
              auVar82._0_4_ = auVar138._0_4_ * auVar125._0_4_;
              auVar82._8_4_ = auVar138._8_4_ * auVar125._8_4_;
              auVar82._12_4_ = auVar138._12_4_ * auVar125._12_4_;
              auVar82._16_4_ = auVar138._16_4_ * 0.0;
              auVar82._20_4_ = auVar138._20_4_ * 0.0;
              auVar82._24_4_ = auVar138._24_4_ * 0.0;
              auVar82._28_4_ = local_2bc0._28_4_;
              auVar160 = vminps_avx(auVar82,auVar169);
              auVar83._4_4_ = auVar138._4_4_ * auVar31._4_4_;
              auVar83._0_4_ = auVar138._0_4_ * auVar31._0_4_;
              auVar83._8_4_ = auVar138._8_4_ * auVar31._8_4_;
              auVar83._12_4_ = auVar138._12_4_ * auVar31._12_4_;
              auVar83._16_4_ = auVar138._16_4_ * 0.0;
              auVar83._20_4_ = auVar138._20_4_ * 0.0;
              auVar83._24_4_ = auVar138._24_4_ * 0.0;
              auVar83._28_4_ = auVar138._28_4_;
              auVar138 = vminps_avx(auVar83,auVar169);
              auVar115 = vsubps_avx(auVar169,auVar160);
              auVar129 = vsubps_avx(auVar169,auVar138);
              auVar87._8_8_ = uStack_2758;
              auVar87._0_8_ = local_2760;
              auVar87._16_8_ = uStack_2750;
              auVar87._24_8_ = uStack_2748;
              local_29e0 = vblendvps_avx(auVar160,auVar115,auVar87);
              local_29c0 = vblendvps_avx(auVar138,auVar129,auVar87);
              pRVar20 = context->user;
              local_2a40[0] = (RTCHitN)auVar161[0];
              local_2a40[1] = (RTCHitN)auVar161[1];
              local_2a40[2] = (RTCHitN)auVar161[2];
              local_2a40[3] = (RTCHitN)auVar161[3];
              local_2a40[4] = (RTCHitN)auVar161[4];
              local_2a40[5] = (RTCHitN)auVar161[5];
              local_2a40[6] = (RTCHitN)auVar161[6];
              local_2a40[7] = (RTCHitN)auVar161[7];
              local_2a40[8] = (RTCHitN)auVar161[8];
              local_2a40[9] = (RTCHitN)auVar161[9];
              local_2a40[10] = (RTCHitN)auVar161[10];
              local_2a40[0xb] = (RTCHitN)auVar161[0xb];
              local_2a40[0xc] = (RTCHitN)auVar161[0xc];
              local_2a40[0xd] = (RTCHitN)auVar161[0xd];
              local_2a40[0xe] = (RTCHitN)auVar161[0xe];
              local_2a40[0xf] = (RTCHitN)auVar161[0xf];
              local_2a40[0x10] = (RTCHitN)auVar161[0x10];
              local_2a40[0x11] = (RTCHitN)auVar161[0x11];
              local_2a40[0x12] = (RTCHitN)auVar161[0x12];
              local_2a40[0x13] = (RTCHitN)auVar161[0x13];
              local_2a40[0x14] = (RTCHitN)auVar161[0x14];
              local_2a40[0x15] = (RTCHitN)auVar161[0x15];
              local_2a40[0x16] = (RTCHitN)auVar161[0x16];
              local_2a40[0x17] = (RTCHitN)auVar161[0x17];
              local_2a40[0x18] = (RTCHitN)auVar161[0x18];
              local_2a40[0x19] = (RTCHitN)auVar161[0x19];
              local_2a40[0x1a] = (RTCHitN)auVar161[0x1a];
              local_2a40[0x1b] = (RTCHitN)auVar161[0x1b];
              local_2a40[0x1c] = (RTCHitN)auVar161[0x1c];
              local_2a40[0x1d] = (RTCHitN)auVar161[0x1d];
              local_2a40[0x1e] = (RTCHitN)auVar161[0x1e];
              local_2a40[0x1f] = (RTCHitN)auVar161[0x1f];
              local_2a20 = auVar164;
              local_2a00 = auVar139;
              local_29a0 = uVar101;
              uStack_299c = uVar101;
              uStack_2998 = uVar101;
              uStack_2994 = uVar101;
              uStack_2990 = uVar101;
              uStack_298c = uVar101;
              uStack_2988 = uVar101;
              uStack_2984 = uVar101;
              local_2980 = uVar3;
              uStack_297c = uVar3;
              uStack_2978 = uVar3;
              uStack_2974 = uVar3;
              uStack_2970 = uVar3;
              uStack_296c = uVar3;
              uStack_2968 = uVar3;
              uStack_2964 = uVar3;
              auVar160 = vpcmpeqd_avx2(local_29e0,local_29e0);
              local_2d18[1] = auVar160;
              *local_2d18 = auVar160;
              local_2960 = pRVar20->instID[0];
              uStack_295c = local_2960;
              uStack_2958 = local_2960;
              uStack_2954 = local_2960;
              uStack_2950 = local_2960;
              uStack_294c = local_2960;
              uStack_2948 = local_2960;
              uStack_2944 = local_2960;
              local_2940 = pRVar20->instPrimID[0];
              uStack_293c = local_2940;
              uStack_2938 = local_2940;
              uStack_2934 = local_2940;
              uStack_2930 = local_2940;
              uStack_292c = local_2940;
              uStack_2928 = local_2940;
              uStack_2924 = local_2940;
              auVar138 = vblendvps_avx(auVar14,auVar79,auVar144);
              ((Geometry *)((long)ray + 0xc0))->intersectionFilterN =
                   (RTCFilterFunctionN)auVar138._0_8_;
              ((Geometry *)((long)ray + 0xc0))->occlusionFilterN =
                   (RTCFilterFunctionN)auVar138._8_8_;
              ((Geometry *)((long)ray + 0xc0))->pointQueryFunc =
                   (RTCPointQueryFunction)auVar138._16_8_;
              *(long *)&((Geometry *)((long)ray + 0xc0))->field_0x58 = auVar138._24_8_;
              local_2d10.valid = (int *)local_2ca0;
              local_2d10.geometryUserPtr = unaff_R15->userPtr;
              local_2d10.context = context->user;
              local_2d10.hit = local_2a40;
              local_2d10.N = 8;
              local_2d10.ray = (RTCRayN *)ray;
              local_2ca0 = auVar144;
              local_2d60 = auVar14;
              if (unaff_R15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                local_2da0 = auVar97;
                auVar165 = ZEXT1664(auVar139._0_16_);
                auVar174 = ZEXT1664(auVar164._0_16_);
                auVar179 = ZEXT1664(auVar161._0_16_);
                local_2da8 = (Geometry *)ray;
                (*unaff_R15->occlusionFilterN)(&local_2d10);
                auVar183._8_56_ = extraout_var;
                auVar183._0_8_ = extraout_XMM1_Qa;
                auVar160 = vpcmpeqd_avx2(auVar183._0_32_,auVar183._0_32_);
                auVar190 = ZEXT3264(CONCAT428(0x3f800003,
                                              CONCAT424(0x3f800003,
                                                        CONCAT420(0x3f800003,
                                                                  CONCAT416(0x3f800003,
                                                                            CONCAT412(0x3f800003,
                                                                                      CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                auVar185 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar97 = local_2da0;
                ray = (RayK<8> *)local_2da8;
              }
              auVar144 = vpcmpeqd_avx2(ZEXT1632(ZEXT816(0) << 0x40),local_2ca0);
              auVar138 = auVar160 & ~auVar144;
              if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar138 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar138 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar138 >> 0x7f,0) == '\0') &&
                    (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar138 >> 0xbf,0) == '\0') &&
                  (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar138[0x1f]) {
                auVar144 = auVar144 ^ auVar160;
              }
              else {
                p_Var21 = context->args->filter;
                if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((unaff_R15->field_8).field_0x2 & 0x40) != 0)
                    ))) {
                  local_2da0 = auVar97;
                  auVar165 = ZEXT1664(auVar165._0_16_);
                  auVar174 = ZEXT1664(auVar174._0_16_);
                  auVar179 = ZEXT1664(auVar179._0_16_);
                  (*p_Var21)(&local_2d10);
                  auVar185._8_56_ = extraout_var_00;
                  auVar185._0_8_ = extraout_XMM1_Qa_00;
                  auVar160 = vpcmpeqd_avx2(auVar185._0_32_,auVar185._0_32_);
                  auVar190 = ZEXT3264(CONCAT428(0x3f800003,
                                                CONCAT424(0x3f800003,
                                                          CONCAT420(0x3f800003,
                                                                    CONCAT416(0x3f800003,
                                                                              CONCAT412(0x3f800003,
                                                                                        CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                  auVar185 = ZEXT3264(CONCAT428(0x7f800000,
                                                CONCAT424(0x7f800000,
                                                          CONCAT420(0x7f800000,
                                                                    CONCAT416(0x7f800000,
                                                                              CONCAT412(0x7f800000,
                                                                                        CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  auVar97 = local_2da0;
                  unaff_R15 = (Geometry *)ray;
                }
                auVar138 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),local_2ca0);
                auVar144 = auVar138 ^ auVar160;
                auVar132._8_4_ = 0xff800000;
                auVar132._0_8_ = 0xff800000ff800000;
                auVar132._12_4_ = 0xff800000;
                auVar132._16_4_ = 0xff800000;
                auVar132._20_4_ = 0xff800000;
                auVar132._24_4_ = 0xff800000;
                auVar132._28_4_ = 0xff800000;
                auVar17._0_8_ = *(undefined8 *)(local_2d10.ray + 0x100);
                auVar17._8_8_ = *(undefined8 *)(local_2d10.ray + 0x108);
                auVar17._16_8_ = *(undefined8 *)(local_2d10.ray + 0x110);
                auVar17._24_8_ = *(undefined8 *)(local_2d10.ray + 0x118);
                auVar138 = vblendvps_avx(auVar132,auVar17,auVar138);
                *(long *)(local_2d10.ray + 0x100) = auVar138._0_8_;
                *(long *)(local_2d10.ray + 0x108) = auVar138._8_8_;
                *(long *)(local_2d10.ray + 0x110) = auVar138._16_8_;
                *(long *)(local_2d10.ray + 0x118) = auVar138._24_8_;
              }
              auVar138 = vblendvps_avx(local_2d60,*(undefined1 (*) [32])local_2d68,auVar144);
              *(undefined1 (*) [32])local_2d68 = auVar138;
            }
            auVar144 = vandnps_avx(auVar144,local_2d40);
          }
        }
        bVar102 = (((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar144 >> 0x7f,0) != '\0') ||
                    (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar144 >> 0xbf,0) != '\0') ||
                  (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar144[0x1f] < '\0';
      }
      auVar183 = ZEXT3264(local_2c60);
      if ((!bVar102) || (bVar102 = 2 < uVar100, uVar100 = uVar100 + 1, bVar102)) break;
    }
    auVar126 = vandps_avx(auVar144,local_2ce0);
    auVar144 = local_2ce0 & auVar144;
    auVar138 = local_2ce0;
    if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar144 >> 0x7f,0) == '\0') &&
          (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar144 >> 0xbf,0) == '\0') &&
        (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar144[0x1f])
    break;
  }
  auVar144 = vpcmpeqd_avx2(auVar138,auVar138);
  auVar118._0_4_ = auVar126._0_4_ ^ auVar144._0_4_;
  auVar118._4_4_ = auVar126._4_4_ ^ auVar144._4_4_;
  auVar118._8_4_ = auVar126._8_4_ ^ auVar144._8_4_;
  auVar118._12_4_ = auVar126._12_4_ ^ auVar144._12_4_;
  auVar118._16_4_ = auVar126._16_4_ ^ auVar144._16_4_;
  auVar118._20_4_ = auVar126._20_4_ ^ auVar144._20_4_;
  auVar118._24_4_ = auVar126._24_4_ ^ auVar144._24_4_;
  auVar118._28_4_ = auVar126._28_4_ ^ auVar144._28_4_;
LAB_005b7478:
  auVar134 = ZEXT3264(auVar144);
  local_2c20 = vorps_avx(auVar118,local_2c20);
  auVar144 = auVar144 & ~local_2c20;
  if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar144 >> 0x7f,0) == '\0') &&
        (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar144 >> 0xbf,0) == '\0') &&
      (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar144[0x1f]) {
LAB_005b74b6:
    iVar93 = 3;
  }
  else {
    auVar134 = ZEXT3264(local_2780);
    auVar143._8_4_ = 0xff800000;
    auVar143._0_8_ = 0xff800000ff800000;
    auVar143._12_4_ = 0xff800000;
    auVar143._16_4_ = 0xff800000;
    auVar143._20_4_ = 0xff800000;
    auVar143._24_4_ = 0xff800000;
    auVar143._28_4_ = 0xff800000;
    local_2780 = vblendvps_avx(local_2780,auVar143,local_2c20);
    iVar93 = 0;
  }
LAB_005b74b9:
  if (iVar93 == 3) {
    auVar144 = vandps_avx(local_2720,local_2c20);
    auVar133._8_4_ = 0xff800000;
    auVar133._0_8_ = 0xff800000ff800000;
    auVar133._12_4_ = 0xff800000;
    auVar133._16_4_ = 0xff800000;
    auVar133._20_4_ = 0xff800000;
    auVar133._24_4_ = 0xff800000;
    auVar133._28_4_ = 0xff800000;
    auVar144 = vmaskmovps_avx(auVar144,auVar133);
    *(undefined1 (*) [32])local_2d68 = auVar144;
    return;
  }
  goto LAB_005b61a2;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }